

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  ulong uVar52;
  long lVar53;
  byte bVar54;
  uint uVar55;
  uint uVar56;
  bool bVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  float fVar61;
  undefined4 uVar62;
  float fVar63;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar93;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined8 uVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vint4 ai;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  float fVar160;
  float fVar161;
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar162;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar190;
  float fVar191;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar192;
  undefined1 auVar189 [32];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar214;
  vfloat4 a0_3;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  vfloat4 a0_1;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  vfloat4 a0;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  undefined1 auVar249 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  int local_4fc;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [32];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  uint local_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  ulong local_370;
  undefined1 local_368 [32];
  RTCFilterFunctionNArguments local_348;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 auStack_2e8 [16];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  undefined4 local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint uStack_178;
  float afStack_174 [7];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar265 [32];
  
  PVar4 = prim[1];
  uVar59 = (ulong)(byte)PVar4;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar64._0_4_ = fVar60 * auVar13._0_4_;
  auVar64._4_4_ = fVar60 * auVar13._4_4_;
  auVar64._8_4_ = fVar60 * auVar13._8_4_;
  auVar64._12_4_ = fVar60 * auVar13._12_4_;
  auVar144._0_4_ = fVar60 * (ray->dir).field_0.m128[0];
  auVar144._4_4_ = fVar60 * (ray->dir).field_0.m128[1];
  auVar144._8_4_ = fVar60 * (ray->dir).field_0.m128[2];
  auVar144._12_4_ = fVar60 * (ray->dir).field_0.m128[3];
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar262 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar262 = vcvtdq2ps_avx(auVar262);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar59 + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  uVar52 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + uVar59 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar52 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar253._4_4_ = auVar144._0_4_;
  auVar253._0_4_ = auVar144._0_4_;
  auVar253._8_4_ = auVar144._0_4_;
  auVar253._12_4_ = auVar144._0_4_;
  auVar230 = vshufps_avx(auVar144,auVar144,0x55);
  auVar65 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar60 = auVar65._0_4_;
  auVar227._0_4_ = fVar60 * auVar262._0_4_;
  fVar92 = auVar65._4_4_;
  auVar227._4_4_ = fVar92 * auVar262._4_4_;
  fVar118 = auVar65._8_4_;
  auVar227._8_4_ = fVar118 * auVar262._8_4_;
  fVar93 = auVar65._12_4_;
  auVar227._12_4_ = fVar93 * auVar262._12_4_;
  auVar215._0_4_ = auVar235._0_4_ * fVar60;
  auVar215._4_4_ = auVar235._4_4_ * fVar92;
  auVar215._8_4_ = auVar235._8_4_ * fVar118;
  auVar215._12_4_ = auVar235._12_4_ * fVar93;
  auVar193._0_4_ = auVar108._0_4_ * fVar60;
  auVar193._4_4_ = auVar108._4_4_ * fVar92;
  auVar193._8_4_ = auVar108._8_4_ * fVar118;
  auVar193._12_4_ = auVar108._12_4_ * fVar93;
  auVar65 = vfmadd231ps_fma(auVar227,auVar230,auVar10);
  auVar96 = vfmadd231ps_fma(auVar215,auVar230,auVar12);
  auVar230 = vfmadd231ps_fma(auVar193,auVar66,auVar230);
  auVar123 = vfmadd231ps_fma(auVar65,auVar253,auVar13);
  auVar96 = vfmadd231ps_fma(auVar96,auVar253,auVar11);
  auVar132 = vfmadd231ps_fma(auVar230,auVar67,auVar253);
  auVar254._4_4_ = auVar64._0_4_;
  auVar254._0_4_ = auVar64._0_4_;
  auVar254._8_4_ = auVar64._0_4_;
  auVar254._12_4_ = auVar64._0_4_;
  auVar230 = vshufps_avx(auVar64,auVar64,0x55);
  auVar65 = vshufps_avx(auVar64,auVar64,0xaa);
  fVar60 = auVar65._0_4_;
  auVar145._0_4_ = fVar60 * auVar262._0_4_;
  fVar92 = auVar65._4_4_;
  auVar145._4_4_ = fVar92 * auVar262._4_4_;
  fVar118 = auVar65._8_4_;
  auVar145._8_4_ = fVar118 * auVar262._8_4_;
  fVar93 = auVar65._12_4_;
  auVar145._12_4_ = fVar93 * auVar262._12_4_;
  auVar95._0_4_ = auVar235._0_4_ * fVar60;
  auVar95._4_4_ = auVar235._4_4_ * fVar92;
  auVar95._8_4_ = auVar235._8_4_ * fVar118;
  auVar95._12_4_ = auVar235._12_4_ * fVar93;
  auVar65._0_4_ = auVar108._0_4_ * fVar60;
  auVar65._4_4_ = auVar108._4_4_ * fVar92;
  auVar65._8_4_ = auVar108._8_4_ * fVar118;
  auVar65._12_4_ = auVar108._12_4_ * fVar93;
  auVar10 = vfmadd231ps_fma(auVar145,auVar230,auVar10);
  auVar262 = vfmadd231ps_fma(auVar95,auVar230,auVar12);
  auVar12 = vfmadd231ps_fma(auVar65,auVar230,auVar66);
  auVar235 = vfmadd231ps_fma(auVar10,auVar254,auVar13);
  auVar66 = vfmadd231ps_fma(auVar262,auVar254,auVar11);
  auVar108 = vfmadd231ps_fma(auVar12,auVar254,auVar67);
  local_3f8._8_4_ = 0x7fffffff;
  local_3f8._0_8_ = 0x7fffffff7fffffff;
  local_3f8._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar123,local_3f8);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar131,1);
  auVar10 = vblendvps_avx(auVar123,auVar131,auVar13);
  auVar13 = vandps_avx(auVar96,local_3f8);
  auVar13 = vcmpps_avx(auVar13,auVar131,1);
  auVar262 = vblendvps_avx(auVar96,auVar131,auVar13);
  auVar13 = vandps_avx(auVar132,local_3f8);
  auVar13 = vcmpps_avx(auVar13,auVar131,1);
  auVar13 = vblendvps_avx(auVar132,auVar131,auVar13);
  auVar11 = vrcpps_avx(auVar10);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar11,auVar177);
  auVar11 = vfmadd132ps_fma(auVar10,auVar11,auVar11);
  auVar10 = vrcpps_avx(auVar262);
  auVar262 = vfnmadd213ps_fma(auVar262,auVar10,auVar177);
  auVar12 = vfmadd132ps_fma(auVar262,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar10,auVar177);
  auVar67 = vfmadd132ps_fma(auVar13,auVar10,auVar10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar235);
  auVar132._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar132._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar132._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar132._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar235);
  auVar146._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar146._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar146._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar146._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar4;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar262);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar59 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar66);
  auVar194._0_4_ = auVar13._0_4_ * auVar12._0_4_;
  auVar194._4_4_ = auVar13._4_4_ * auVar12._4_4_;
  auVar194._8_4_ = auVar13._8_4_ * auVar12._8_4_;
  auVar194._12_4_ = auVar13._12_4_ * auVar12._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar10);
  auVar13 = vsubps_avx(auVar13,auVar66);
  auVar230._0_4_ = auVar12._0_4_ * auVar13._0_4_;
  auVar230._4_4_ = auVar12._4_4_ * auVar13._4_4_;
  auVar230._8_4_ = auVar12._8_4_ * auVar13._8_4_;
  auVar230._12_4_ = auVar12._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar52 + uVar59 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar108);
  auVar123._0_4_ = auVar67._0_4_ * auVar13._0_4_;
  auVar123._4_4_ = auVar67._4_4_ * auVar13._4_4_;
  auVar123._8_4_ = auVar67._8_4_ * auVar13._8_4_;
  auVar123._12_4_ = auVar67._12_4_ * auVar13._12_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar235);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar108);
  auVar66._0_4_ = auVar67._0_4_ * auVar13._0_4_;
  auVar66._4_4_ = auVar67._4_4_ * auVar13._4_4_;
  auVar66._8_4_ = auVar67._8_4_ * auVar13._8_4_;
  auVar66._12_4_ = auVar67._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar132,auVar146);
  auVar10 = vpminsd_avx(auVar194,auVar230);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vpminsd_avx(auVar123,auVar66);
  uVar62 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar202._4_4_ = uVar62;
  auVar202._0_4_ = uVar62;
  auVar202._8_4_ = uVar62;
  auVar202._12_4_ = uVar62;
  auVar10 = vmaxps_avx(auVar10,auVar202);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  local_258._0_4_ = auVar13._0_4_ * 0.99999964;
  local_258._4_4_ = auVar13._4_4_ * 0.99999964;
  local_258._8_4_ = auVar13._8_4_ * 0.99999964;
  local_258._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar132,auVar146);
  auVar10 = vpmaxsd_avx(auVar194,auVar230);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar10 = vpmaxsd_avx(auVar123,auVar66);
  fVar60 = ray->tfar;
  auVar108._4_4_ = fVar60;
  auVar108._0_4_ = fVar60;
  auVar108._8_4_ = fVar60;
  auVar108._12_4_ = fVar60;
  auVar10 = vminps_avx(auVar10,auVar108);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar67._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar67._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar67._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar67._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar96[4] = PVar4;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar4;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar4;
  auVar96._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar13 = vcmpps_avx(local_258,auVar67,2);
  auVar13 = vandps_avx(auVar13,auVar10);
  uVar51 = vmovmskps_avx(auVar13);
  if (uVar51 == 0) {
    return false;
  }
  uVar51 = uVar51 & 0xff;
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  local_408 = 0x80000000;
  uStack_404 = 0x80000000;
  uStack_400 = 0x80000000;
  uStack_3fc = 0x80000000;
LAB_015cf237:
  lVar53 = 0;
  uVar59 = (ulong)uVar51;
  for (uVar52 = uVar59; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  local_4c0 = (ulong)*(uint *)(prim + 2);
  local_370 = (ulong)*(uint *)(prim + lVar53 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_4c0].ptr;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_370);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar235 = *(undefined1 (*) [16])(_Var8 + uVar52 * (long)pvVar7);
  auVar13 = *(undefined1 (*) [16])(_Var8 + (uVar52 + 1) * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar52 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar52 + 3));
  fVar60 = *pfVar1;
  fVar92 = pfVar1[1];
  fVar118 = pfVar1[2];
  fVar93 = pfVar1[3];
  lVar53 = *(long *)&pGVar5[1].time_range.upper;
  auVar262 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * uVar52);
  auVar11 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * (uVar52 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * (uVar52 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * (uVar52 + 3));
  fVar61 = *pfVar1;
  fVar63 = pfVar1[1];
  fVar143 = pfVar1[2];
  fVar214 = pfVar1[3];
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar52 = uVar59; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar68._0_4_ = fVar61 * 0.0;
  auVar68._4_4_ = fVar63 * 0.0;
  auVar68._8_4_ = fVar143 * 0.0;
  auVar68._12_4_ = fVar214 * 0.0;
  auVar243._8_4_ = 0x3e2aaaab;
  auVar243._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar243._12_4_ = 0x3e2aaaab;
  auVar67 = vfmadd213ps_fma(auVar243,auVar12,auVar68);
  auVar119._8_4_ = 0x3f2aaaab;
  auVar119._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar119._12_4_ = 0x3f2aaaab;
  auVar67 = vfmadd231ps_fma(auVar67,auVar11,auVar119);
  auVar66 = vfmadd231ps_fma(auVar67,auVar262,auVar243);
  auVar178._8_4_ = 0x3f000000;
  auVar178._0_8_ = 0x3f0000003f000000;
  auVar178._12_4_ = 0x3f000000;
  auVar67 = vfmadd231ps_fma(auVar68,auVar12,auVar178);
  auVar67 = vfnmadd231ps_fma(auVar67,auVar11,ZEXT816(0) << 0x40);
  auVar230 = vfnmadd231ps_fma(auVar67,auVar262,auVar178);
  auVar228._0_4_ = fVar60 * 0.0;
  auVar228._4_4_ = fVar92 * 0.0;
  auVar228._8_4_ = fVar118 * 0.0;
  auVar228._12_4_ = fVar93 * 0.0;
  auVar67 = vfmadd213ps_fma(auVar243,auVar10,auVar228);
  auVar67 = vfmadd231ps_fma(auVar67,auVar13,auVar119);
  auVar67 = vfmadd231ps_fma(auVar67,auVar235,auVar243);
  auVar108 = vfmadd231ps_fma(auVar228,auVar10,auVar178);
  auVar108 = vfnmadd231ps_fma(auVar108,auVar13,ZEXT816(0) << 0x40);
  auVar65 = vfnmadd231ps_fma(auVar108,auVar235,auVar178);
  auVar260._0_4_ = fVar61 * 0.16666667;
  auVar260._4_4_ = fVar63 * 0.16666667;
  auVar260._8_4_ = fVar143 * 0.16666667;
  auVar260._12_4_ = fVar214 * 0.16666667;
  auVar120._8_4_ = 0x3f2aaaab;
  auVar120._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar120._12_4_ = 0x3f2aaaab;
  auVar108 = vfmadd231ps_fma(auVar260,auVar12,auVar120);
  auVar108 = vfmadd231ps_fma(auVar108,auVar11,auVar243);
  auVar123 = ZEXT816(0) << 0x20;
  auVar108 = vfmadd231ps_fma(auVar108,auVar262,auVar123);
  auVar121._0_4_ = fVar61 * 0.5;
  auVar121._4_4_ = fVar63 * 0.5;
  auVar121._8_4_ = fVar143 * 0.5;
  auVar121._12_4_ = fVar214 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar121,auVar123,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar178,auVar11);
  auVar96 = vfnmadd231ps_fma(auVar11,auVar123,auVar262);
  auVar195._0_4_ = fVar60 * 0.16666667;
  auVar195._4_4_ = fVar92 * 0.16666667;
  auVar195._8_4_ = fVar118 * 0.16666667;
  auVar195._12_4_ = fVar93 * 0.16666667;
  auVar203._8_4_ = 0x3f2aaaab;
  auVar203._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar203._12_4_ = 0x3f2aaaab;
  auVar262 = vfmadd231ps_fma(auVar195,auVar10,auVar203);
  auVar262 = vfmadd231ps_fma(auVar262,auVar13,auVar243);
  auVar12 = vfmadd231ps_fma(auVar262,auVar235,auVar123);
  auVar204._0_4_ = fVar60 * 0.5;
  auVar204._4_4_ = fVar92 * 0.5;
  auVar204._8_4_ = fVar118 * 0.5;
  auVar204._12_4_ = fVar93 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar204,auVar123,auVar10);
  auVar13 = vfnmadd231ps_fma(auVar10,auVar178,auVar13);
  auVar235 = vfnmadd231ps_fma(auVar13,auVar123,auVar235);
  auVar13 = vshufps_avx(auVar230,auVar230,0xc9);
  auVar10 = vshufps_avx(auVar67,auVar67,0xc9);
  fVar61 = auVar230._0_4_;
  auVar147._0_4_ = fVar61 * auVar10._0_4_;
  fVar63 = auVar230._4_4_;
  auVar147._4_4_ = fVar63 * auVar10._4_4_;
  fVar143 = auVar230._8_4_;
  auVar147._8_4_ = fVar143 * auVar10._8_4_;
  fVar214 = auVar230._12_4_;
  auVar147._12_4_ = fVar214 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar147,auVar13,auVar67);
  auVar262 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar148._0_4_ = fVar61 * auVar10._0_4_;
  auVar148._4_4_ = fVar63 * auVar10._4_4_;
  auVar148._8_4_ = fVar143 * auVar10._8_4_;
  auVar148._12_4_ = fVar214 * auVar10._12_4_;
  auVar13 = vfmsub231ps_fma(auVar148,auVar13,auVar65);
  auVar11 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar176 = auVar96._0_4_;
  auVar133._0_4_ = fVar176 * auVar10._0_4_;
  fVar190 = auVar96._4_4_;
  auVar133._4_4_ = fVar190 * auVar10._4_4_;
  fVar191 = auVar96._8_4_;
  auVar133._8_4_ = fVar191 * auVar10._8_4_;
  fVar192 = auVar96._12_4_;
  auVar133._12_4_ = fVar192 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar133,auVar13,auVar12);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar235,auVar235,0xc9);
  auVar163._0_4_ = fVar176 * auVar10._0_4_;
  auVar163._4_4_ = fVar190 * auVar10._4_4_;
  auVar163._8_4_ = fVar191 * auVar10._8_4_;
  auVar163._12_4_ = fVar192 * auVar10._12_4_;
  auVar13 = vfmsub231ps_fma(auVar163,auVar13,auVar235);
  auVar235 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vdpps_avx(auVar262,auVar262,0x7f);
  fVar92 = auVar13._0_4_;
  auVar67 = ZEXT416((uint)fVar92);
  auVar10 = vrsqrtss_avx(auVar67,auVar67);
  fVar60 = auVar10._0_4_;
  fVar60 = fVar60 * 1.5 + fVar92 * -0.5 * fVar60 * fVar60 * fVar60;
  auVar10 = vdpps_avx(auVar262,auVar11,0x7f);
  fVar142 = fVar60 * auVar262._0_4_;
  fVar160 = fVar60 * auVar262._4_4_;
  fVar161 = fVar60 * auVar262._8_4_;
  fVar162 = fVar60 * auVar262._12_4_;
  auVar216._0_4_ = auVar11._0_4_ * fVar92;
  auVar216._4_4_ = auVar11._4_4_ * fVar92;
  auVar216._8_4_ = auVar11._8_4_ * fVar92;
  auVar216._12_4_ = auVar11._12_4_ * fVar92;
  fVar92 = auVar10._0_4_;
  auVar179._0_4_ = fVar92 * auVar262._0_4_;
  auVar179._4_4_ = fVar92 * auVar262._4_4_;
  auVar179._8_4_ = fVar92 * auVar262._8_4_;
  auVar179._12_4_ = fVar92 * auVar262._12_4_;
  auVar262 = vsubps_avx(auVar216,auVar179);
  auVar10 = vrcpss_avx(auVar67,auVar67);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar118 = auVar10._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar93 = auVar13._0_4_;
  auVar67 = ZEXT416((uint)fVar93);
  auVar10 = vrsqrtss_avx(auVar67,auVar67);
  fVar92 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar12,auVar235,0x7f);
  fVar92 = fVar92 * 1.5 + fVar93 * -0.5 * fVar92 * fVar92 * fVar92;
  fVar242 = fVar92 * auVar12._0_4_;
  fVar250 = fVar92 * auVar12._4_4_;
  fVar251 = fVar92 * auVar12._8_4_;
  fVar252 = fVar92 * auVar12._12_4_;
  auVar164._0_4_ = fVar93 * auVar235._0_4_;
  auVar164._4_4_ = fVar93 * auVar235._4_4_;
  auVar164._8_4_ = fVar93 * auVar235._8_4_;
  auVar164._12_4_ = fVar93 * auVar235._12_4_;
  fVar93 = auVar10._0_4_;
  auVar134._0_4_ = fVar93 * auVar12._0_4_;
  auVar134._4_4_ = fVar93 * auVar12._4_4_;
  auVar134._8_4_ = fVar93 * auVar12._8_4_;
  auVar134._12_4_ = fVar93 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar164,auVar134);
  auVar10 = vrcpss_avx(auVar67,auVar67);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar10,ZEXT416(0x40000000));
  fVar93 = auVar13._0_4_ * auVar10._0_4_;
  auVar13 = vshufps_avx(auVar66,auVar66,0xff);
  auVar196._0_4_ = auVar13._0_4_ * fVar142;
  auVar196._4_4_ = auVar13._4_4_ * fVar160;
  auVar196._8_4_ = auVar13._8_4_ * fVar161;
  auVar196._12_4_ = auVar13._12_4_ * fVar162;
  local_418 = vsubps_avx(auVar66,auVar196);
  auVar10 = vshufps_avx(auVar230,auVar230,0xff);
  auVar149._0_4_ = auVar10._0_4_ * fVar142 + auVar13._0_4_ * fVar60 * fVar118 * auVar262._0_4_;
  auVar149._4_4_ = auVar10._4_4_ * fVar160 + auVar13._4_4_ * fVar60 * fVar118 * auVar262._4_4_;
  auVar149._8_4_ = auVar10._8_4_ * fVar161 + auVar13._8_4_ * fVar60 * fVar118 * auVar262._8_4_;
  auVar149._12_4_ = auVar10._12_4_ * fVar162 + auVar13._12_4_ * fVar60 * fVar118 * auVar262._12_4_;
  auVar262 = vsubps_avx(auVar230,auVar149);
  local_428._0_4_ = auVar196._0_4_ + auVar66._0_4_;
  local_428._4_4_ = auVar196._4_4_ + auVar66._4_4_;
  fStack_420 = auVar196._8_4_ + auVar66._8_4_;
  fStack_41c = auVar196._12_4_ + auVar66._12_4_;
  auVar13 = vshufps_avx(auVar108,auVar108,0xff);
  auVar97._0_4_ = fVar242 * auVar13._0_4_;
  auVar97._4_4_ = fVar250 * auVar13._4_4_;
  auVar97._8_4_ = fVar251 * auVar13._8_4_;
  auVar97._12_4_ = fVar252 * auVar13._12_4_;
  local_438 = vsubps_avx(auVar108,auVar97);
  auVar10 = vshufps_avx(auVar96,auVar96,0xff);
  auVar69._0_4_ = fVar242 * auVar10._0_4_ + auVar13._0_4_ * fVar92 * auVar11._0_4_ * fVar93;
  auVar69._4_4_ = fVar250 * auVar10._4_4_ + auVar13._4_4_ * fVar92 * auVar11._4_4_ * fVar93;
  auVar69._8_4_ = fVar251 * auVar10._8_4_ + auVar13._8_4_ * fVar92 * auVar11._8_4_ * fVar93;
  auVar69._12_4_ = fVar252 * auVar10._12_4_ + auVar13._12_4_ * fVar92 * auVar11._12_4_ * fVar93;
  auVar13 = vsubps_avx(auVar96,auVar69);
  local_4b8 = auVar108._0_4_ + auVar97._0_4_;
  fStack_4b4 = auVar108._4_4_ + auVar97._4_4_;
  fStack_4b0 = auVar108._8_4_ + auVar97._8_4_;
  fStack_4ac = auVar108._12_4_ + auVar97._12_4_;
  local_448._0_4_ = local_418._0_4_ + auVar262._0_4_ * 0.33333334;
  local_448._4_4_ = local_418._4_4_ + auVar262._4_4_ * 0.33333334;
  local_448._8_4_ = local_418._8_4_ + auVar262._8_4_ * 0.33333334;
  local_448._12_4_ = local_418._12_4_ + auVar262._12_4_ * 0.33333334;
  auVar70._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar70._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar70._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar70._12_4_ = auVar13._12_4_ * 0.33333334;
  local_458 = vsubps_avx(local_438,auVar70);
  aVar2 = (ray->org).field_0;
  auVar262 = vsubps_avx(local_418,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar262,auVar262,0x55);
  auVar10 = vshufps_avx(auVar262,auVar262,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar60 = (pre->ray_space).vz.field_0.m128[0];
  fVar92 = (pre->ray_space).vz.field_0.m128[1];
  fVar118 = (pre->ray_space).vz.field_0.m128[2];
  fVar93 = (pre->ray_space).vz.field_0.m128[3];
  auVar71._0_4_ = fVar60 * auVar10._0_4_;
  auVar71._4_4_ = fVar92 * auVar10._4_4_;
  auVar71._8_4_ = fVar118 * auVar10._8_4_;
  auVar71._12_4_ = fVar93 * auVar10._12_4_;
  auVar230 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar13);
  auVar11 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar11,auVar11,0x55);
  auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar72._0_4_ = fVar60 * auVar10._0_4_;
  auVar72._4_4_ = fVar92 * auVar10._4_4_;
  auVar72._8_4_ = fVar118 * auVar10._8_4_;
  auVar72._12_4_ = fVar93 * auVar10._12_4_;
  auVar65 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar13);
  auVar10 = vsubps_avx(local_458,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar73._0_4_ = fVar60 * auVar13._0_4_;
  auVar73._4_4_ = fVar92 * auVar13._4_4_;
  auVar73._8_4_ = fVar118 * auVar13._8_4_;
  auVar73._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar10,auVar10,0x55);
  auVar96 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar13);
  auVar12 = vsubps_avx(local_438,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar74._0_4_ = fVar60 * auVar13._0_4_;
  auVar74._4_4_ = fVar92 * auVar13._4_4_;
  auVar74._8_4_ = fVar118 * auVar13._8_4_;
  auVar74._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar12,auVar12,0x55);
  auVar123 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar13);
  auVar235 = vsubps_avx(_local_428,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar150._0_4_ = fVar60 * auVar13._0_4_;
  auVar150._4_4_ = fVar92 * auVar13._4_4_;
  auVar150._8_4_ = fVar118 * auVar13._8_4_;
  auVar150._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar235,auVar235,0x55);
  auVar132 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar13);
  local_468._0_4_ = (fVar61 + auVar149._0_4_) * 0.33333334 + (float)local_428._0_4_;
  local_468._4_4_ = (fVar63 + auVar149._4_4_) * 0.33333334 + (float)local_428._4_4_;
  fStack_460 = (fVar143 + auVar149._8_4_) * 0.33333334 + fStack_420;
  fStack_45c = (fVar214 + auVar149._12_4_) * 0.33333334 + fStack_41c;
  auVar67 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar229._0_4_ = fVar60 * auVar13._0_4_;
  auVar229._4_4_ = fVar92 * auVar13._4_4_;
  auVar229._8_4_ = fVar118 * auVar13._8_4_;
  auVar229._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar67,auVar67,0x55);
  auVar64 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar3,auVar13);
  auVar217._0_4_ = (fVar176 + auVar69._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar190 + auVar69._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar191 + auVar69._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar192 + auVar69._12_4_) * 0.33333334;
  auVar44._4_4_ = fStack_4b4;
  auVar44._0_4_ = local_4b8;
  auVar44._8_4_ = fStack_4b0;
  auVar44._12_4_ = fStack_4ac;
  _local_478 = vsubps_avx(auVar44,auVar217);
  auVar66 = vsubps_avx(_local_478,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar218._0_4_ = fVar60 * auVar13._0_4_;
  auVar218._4_4_ = fVar92 * auVar13._4_4_;
  auVar218._8_4_ = fVar118 * auVar13._8_4_;
  auVar218._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar66,auVar66,0x55);
  auVar95 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar3,auVar13);
  auVar108 = vsubps_avx(auVar44,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar108,auVar108,0xaa);
  auVar180._0_4_ = fVar60 * auVar13._0_4_;
  auVar180._4_4_ = fVar92 * auVar13._4_4_;
  auVar180._8_4_ = fVar118 * auVar13._8_4_;
  auVar180._12_4_ = fVar93 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar108,auVar108,0x55);
  auVar13 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar13);
  local_4d8._0_4_ = auVar262._0_4_;
  auVar165._4_4_ = local_4d8._0_4_;
  auVar165._0_4_ = local_4d8._0_4_;
  auVar165._8_4_ = local_4d8._0_4_;
  auVar165._12_4_ = local_4d8._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar230 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar3,auVar165);
  local_4e8._0_4_ = auVar11._0_4_;
  auVar166._4_4_ = local_4e8._0_4_;
  auVar166._0_4_ = local_4e8._0_4_;
  auVar166._8_4_ = local_4e8._0_4_;
  auVar166._12_4_ = local_4e8._0_4_;
  auVar11 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar166);
  uVar62 = auVar10._0_4_;
  auVar167._4_4_ = uVar62;
  auVar167._0_4_ = uVar62;
  auVar167._8_4_ = uVar62;
  auVar167._12_4_ = uVar62;
  auVar65 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar3,auVar167);
  uVar62 = auVar12._0_4_;
  auVar168._4_4_ = uVar62;
  auVar168._0_4_ = uVar62;
  auVar168._8_4_ = uVar62;
  auVar168._12_4_ = uVar62;
  auVar12 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar168);
  uVar62 = auVar235._0_4_;
  auVar169._4_4_ = uVar62;
  auVar169._0_4_ = uVar62;
  auVar169._8_4_ = uVar62;
  auVar169._12_4_ = uVar62;
  auVar235 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar3,auVar169);
  uVar62 = auVar67._0_4_;
  auVar170._4_4_ = uVar62;
  auVar170._0_4_ = uVar62;
  auVar170._8_4_ = uVar62;
  auVar170._12_4_ = uVar62;
  auVar67 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar170);
  uVar62 = auVar66._0_4_;
  auVar75._4_4_ = uVar62;
  auVar75._0_4_ = uVar62;
  auVar75._8_4_ = uVar62;
  auVar75._12_4_ = uVar62;
  auVar66 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar75);
  uVar62 = auVar108._0_4_;
  auVar76._4_4_ = uVar62;
  auVar76._0_4_ = uVar62;
  auVar76._8_4_ = uVar62;
  auVar76._12_4_ = uVar62;
  auVar108 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar76);
  local_488 = vmovlhps_avx(auVar230,auVar235);
  local_4e8 = vmovlhps_avx(auVar11,auVar67);
  local_4f8 = vmovlhps_avx(auVar65,auVar66);
  _local_238 = vmovlhps_avx(auVar12,auVar108);
  auVar13 = vminps_avx(local_488,local_4e8);
  auVar10 = vminps_avx(local_4f8,_local_238);
  auVar262 = vminps_avx(auVar13,auVar10);
  auVar13 = vmaxps_avx(local_488,local_4e8);
  auVar10 = vmaxps_avx(local_4f8,_local_238);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vshufpd_avx(auVar262,auVar262,3);
  auVar262 = vminps_avx(auVar262,auVar10);
  auVar10 = vshufpd_avx(auVar13,auVar13,3);
  auVar10 = vmaxps_avx(auVar13,auVar10);
  auVar13 = vandps_avx(local_3f8,auVar262);
  auVar10 = vandps_avx(local_3f8,auVar10);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar10,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  local_388._8_8_ = auVar230._0_8_;
  local_388._0_8_ = auVar230._0_8_;
  local_398._8_8_ = auVar11._0_8_;
  local_398._0_8_ = auVar11._0_8_;
  local_3a8._8_8_ = auVar65._0_8_;
  local_3a8._0_8_ = auVar65._0_8_;
  local_3b8._8_8_ = auVar12._0_8_;
  local_3b8._0_8_ = auVar12._0_8_;
  register0x000012c8 = auVar235._0_8_;
  local_3c8 = auVar235._0_8_;
  local_3d8 = auVar66._0_8_;
  register0x00001488 = local_3d8;
  register0x00001348 = auVar108._0_8_;
  local_3e8 = auVar108._0_8_;
  local_4d8 = ZEXT416((uint)local_198);
  local_1b8 = (uint)local_198 ^ local_408;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  bVar57 = false;
  uVar51 = 0;
  local_208 = vsubps_avx(local_4e8,local_488);
  local_218 = vsubps_avx(local_4f8,local_4e8);
  local_228 = vsubps_avx(_local_238,local_4f8);
  local_268 = vsubps_avx(_local_428,local_418);
  local_278 = vsubps_avx(_local_468,local_448);
  local_288 = vsubps_avx(_local_478,local_458);
  auVar45._4_4_ = fStack_4b4;
  auVar45._0_4_ = local_4b8;
  auVar45._8_4_ = fStack_4b0;
  auVar45._12_4_ = fStack_4ac;
  _local_298 = vsubps_avx(auVar45,local_438);
  auVar77 = ZEXT816(0x3f80000000000000);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_248 = auVar77;
LAB_015cf9dd:
  auVar13 = vshufps_avx(auVar77,auVar77,0x50);
  auVar261._8_4_ = 0x3f800000;
  auVar261._0_8_ = 0x3f8000003f800000;
  auVar261._12_4_ = 0x3f800000;
  auVar265._16_4_ = 0x3f800000;
  auVar265._0_16_ = auVar261;
  auVar265._20_4_ = 0x3f800000;
  auVar265._24_4_ = 0x3f800000;
  auVar265._28_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar261,auVar13);
  fVar60 = auVar13._0_4_;
  auVar78._0_4_ = local_3c8._0_4_ * fVar60;
  fVar92 = auVar13._4_4_;
  auVar78._4_4_ = local_3c8._4_4_ * fVar92;
  fVar118 = auVar13._8_4_;
  auVar78._8_4_ = local_3c8._8_4_ * fVar118;
  fVar93 = auVar13._12_4_;
  auVar78._12_4_ = local_3c8._12_4_ * fVar93;
  fVar162 = auVar67._0_4_;
  auVar171._0_4_ = fVar162 * fVar60;
  fVar242 = auVar67._4_4_;
  auVar171._4_4_ = fVar242 * fVar92;
  auVar171._8_4_ = fVar162 * fVar118;
  auVar171._12_4_ = fVar242 * fVar93;
  auVar135._0_4_ = local_3d8._0_4_ * fVar60;
  auVar135._4_4_ = local_3d8._4_4_ * fVar92;
  auVar135._8_4_ = local_3d8._8_4_ * fVar118;
  auVar135._12_4_ = local_3d8._12_4_ * fVar93;
  auVar109._0_4_ = local_3e8._0_4_ * fVar60;
  auVar109._4_4_ = local_3e8._4_4_ * fVar92;
  auVar109._8_4_ = local_3e8._8_4_ * fVar118;
  auVar109._12_4_ = local_3e8._12_4_ * fVar93;
  auVar12 = vfmadd231ps_fma(auVar78,auVar10,local_388);
  auVar235 = vfmadd231ps_fma(auVar171,auVar10,local_398);
  auVar66 = vfmadd231ps_fma(auVar135,auVar10,local_3a8);
  auVar108 = vfmadd231ps_fma(auVar109,local_3b8,auVar10);
  auVar13 = vmovshdup_avx(local_248);
  fVar60 = local_248._0_4_;
  fStack_e0 = (auVar13._0_4_ - fVar60) * 0.04761905;
  auVar212._4_4_ = fVar60;
  auVar212._0_4_ = fVar60;
  auVar212._8_4_ = fVar60;
  auVar212._12_4_ = fVar60;
  auVar212._16_4_ = fVar60;
  auVar212._20_4_ = fVar60;
  auVar212._24_4_ = fVar60;
  auVar212._28_4_ = fVar60;
  auVar105._0_8_ = auVar13._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar89 = vsubps_avx(auVar105,auVar212);
  uVar62 = auVar12._0_4_;
  auVar258._4_4_ = uVar62;
  auVar258._0_4_ = uVar62;
  auVar258._8_4_ = uVar62;
  auVar258._12_4_ = uVar62;
  auVar258._16_4_ = uVar62;
  auVar258._20_4_ = uVar62;
  auVar258._24_4_ = uVar62;
  auVar258._28_4_ = uVar62;
  auVar13 = vmovshdup_avx(auVar12);
  uVar94 = auVar13._0_8_;
  auVar249._8_8_ = uVar94;
  auVar249._0_8_ = uVar94;
  auVar249._16_8_ = uVar94;
  auVar249._24_8_ = uVar94;
  fVar176 = auVar235._0_4_;
  auVar239._4_4_ = fVar176;
  auVar239._0_4_ = fVar176;
  auVar239._8_4_ = fVar176;
  auVar239._12_4_ = fVar176;
  auVar239._16_4_ = fVar176;
  auVar239._20_4_ = fVar176;
  auVar239._24_4_ = fVar176;
  auVar239._28_4_ = fVar176;
  auVar10 = vmovshdup_avx(auVar235);
  auVar106._0_8_ = auVar10._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar214 = auVar66._0_4_;
  auVar187._4_4_ = fVar214;
  auVar187._0_4_ = fVar214;
  auVar187._8_4_ = fVar214;
  auVar187._12_4_ = fVar214;
  auVar187._16_4_ = fVar214;
  auVar187._20_4_ = fVar214;
  auVar187._24_4_ = fVar214;
  auVar187._28_4_ = fVar214;
  auVar262 = vmovshdup_avx(auVar66);
  auVar200._0_8_ = auVar262._0_8_;
  auVar200._8_8_ = auVar200._0_8_;
  auVar200._16_8_ = auVar200._0_8_;
  auVar200._24_8_ = auVar200._0_8_;
  fVar143 = auVar108._0_4_;
  auVar11 = vmovshdup_avx(auVar108);
  auVar230 = vfmadd132ps_fma(auVar89,auVar212,_DAT_01faff20);
  auVar89 = vsubps_avx(auVar265,ZEXT1632(auVar230));
  fVar60 = auVar230._0_4_;
  fVar92 = auVar230._4_4_;
  auVar14._4_4_ = fVar176 * fVar92;
  auVar14._0_4_ = fVar176 * fVar60;
  fVar118 = auVar230._8_4_;
  auVar14._8_4_ = fVar176 * fVar118;
  fVar93 = auVar230._12_4_;
  auVar14._12_4_ = fVar176 * fVar93;
  auVar14._16_4_ = fVar176 * 0.0;
  auVar14._20_4_ = fVar176 * 0.0;
  auVar14._24_4_ = fVar176 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar230 = vfmadd231ps_fma(auVar14,auVar89,auVar258);
  fVar61 = auVar10._0_4_;
  fVar63 = auVar10._4_4_;
  auVar15._4_4_ = fVar63 * fVar92;
  auVar15._0_4_ = fVar61 * fVar60;
  auVar15._8_4_ = fVar61 * fVar118;
  auVar15._12_4_ = fVar63 * fVar93;
  auVar15._16_4_ = fVar61 * 0.0;
  auVar15._20_4_ = fVar63 * 0.0;
  auVar15._24_4_ = fVar61 * 0.0;
  auVar15._28_4_ = uVar62;
  auVar65 = vfmadd231ps_fma(auVar15,auVar89,auVar249);
  auVar16._4_4_ = fVar214 * fVar92;
  auVar16._0_4_ = fVar214 * fVar60;
  auVar16._8_4_ = fVar214 * fVar118;
  auVar16._12_4_ = fVar214 * fVar93;
  auVar16._16_4_ = fVar214 * 0.0;
  auVar16._20_4_ = fVar214 * 0.0;
  auVar16._24_4_ = fVar214 * 0.0;
  auVar16._28_4_ = auVar13._4_4_;
  auVar96 = vfmadd231ps_fma(auVar16,auVar89,auVar239);
  fVar61 = auVar262._0_4_;
  fVar63 = auVar262._4_4_;
  auVar9._4_4_ = fVar63 * fVar92;
  auVar9._0_4_ = fVar61 * fVar60;
  auVar9._8_4_ = fVar61 * fVar118;
  auVar9._12_4_ = fVar63 * fVar93;
  auVar9._16_4_ = fVar61 * 0.0;
  auVar9._20_4_ = fVar63 * 0.0;
  auVar9._24_4_ = fVar61 * 0.0;
  auVar9._28_4_ = fVar176;
  auVar123 = vfmadd231ps_fma(auVar9,auVar89,auVar106);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  local_4a8._8_8_ = auVar13._0_8_;
  local_4a8._0_8_ = local_4a8._8_8_;
  local_4a8._16_8_ = local_4a8._8_8_;
  local_4a8._24_8_ = local_4a8._8_8_;
  auVar10 = vshufps_avx(auVar12,auVar12,0xff);
  uStack_530 = auVar10._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  auVar17._4_4_ = fVar143 * fVar92;
  auVar17._0_4_ = fVar143 * fVar60;
  auVar17._8_4_ = fVar143 * fVar118;
  auVar17._12_4_ = fVar143 * fVar93;
  auVar17._16_4_ = fVar143 * 0.0;
  auVar17._20_4_ = fVar143 * 0.0;
  auVar17._24_4_ = fVar143 * 0.0;
  auVar17._28_4_ = fVar143;
  auVar12 = vfmadd231ps_fma(auVar17,auVar89,auVar187);
  auVar10 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar188._0_8_ = auVar10._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar188._16_8_ = auVar188._0_8_;
  auVar188._24_8_ = auVar188._0_8_;
  auVar262 = vshufps_avx(auVar235,auVar235,0xff);
  local_368._8_8_ = auVar262._0_8_;
  local_368._0_8_ = local_368._8_8_;
  local_368._16_8_ = local_368._8_8_;
  local_368._24_8_ = local_368._8_8_;
  fVar61 = auVar11._0_4_;
  fVar63 = auVar11._4_4_;
  auVar18._4_4_ = fVar63 * fVar92;
  auVar18._0_4_ = fVar61 * fVar60;
  auVar18._8_4_ = fVar61 * fVar118;
  auVar18._12_4_ = fVar63 * fVar93;
  auVar18._16_4_ = fVar61 * 0.0;
  auVar18._20_4_ = fVar63 * 0.0;
  auVar18._24_4_ = fVar61 * 0.0;
  auVar18._28_4_ = auVar13._4_4_;
  auVar132 = vfmadd231ps_fma(auVar18,auVar89,auVar200);
  auVar241._28_4_ = fVar63;
  auVar241._0_28_ =
       ZEXT1628(CONCAT412(auVar96._12_4_ * fVar93,
                          CONCAT48(auVar96._8_4_ * fVar118,
                                   CONCAT44(auVar96._4_4_ * fVar92,auVar96._0_4_ * fVar60))));
  auVar230 = vfmadd231ps_fma(auVar241,auVar89,ZEXT1632(auVar230));
  fVar61 = auVar262._4_4_;
  auVar20._28_4_ = fVar61;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(auVar123._12_4_ * fVar93,
                          CONCAT48(auVar123._8_4_ * fVar118,
                                   CONCAT44(auVar123._4_4_ * fVar92,auVar123._0_4_ * fVar60))));
  auVar65 = vfmadd231ps_fma(auVar20,auVar89,ZEXT1632(auVar65));
  auVar13 = vshufps_avx(auVar66,auVar66,0xaa);
  uVar94 = auVar13._0_8_;
  auVar175._8_8_ = uVar94;
  auVar175._0_8_ = uVar94;
  auVar175._16_8_ = uVar94;
  auVar175._24_8_ = uVar94;
  auVar11 = vshufps_avx(auVar66,auVar66,0xff);
  uVar94 = auVar11._0_8_;
  auVar266._8_8_ = uVar94;
  auVar266._0_8_ = uVar94;
  auVar266._16_8_ = uVar94;
  auVar266._24_8_ = uVar94;
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar93,
                                               CONCAT48(auVar12._8_4_ * fVar118,
                                                        CONCAT44(auVar12._4_4_ * fVar92,
                                                                 auVar12._0_4_ * fVar60)))),auVar89,
                            ZEXT1632(auVar96));
  auVar12 = vshufps_avx(auVar108,auVar108,0xaa);
  auVar235 = vshufps_avx(auVar108,auVar108,0xff);
  auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar132._12_4_,
                                                CONCAT48(fVar118 * auVar132._8_4_,
                                                         CONCAT44(fVar92 * auVar132._4_4_,
                                                                  fVar60 * auVar132._0_4_)))),
                             auVar89,ZEXT1632(auVar123));
  auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar66._12_4_,
                                               CONCAT48(fVar118 * auVar66._8_4_,
                                                        CONCAT44(fVar92 * auVar66._4_4_,
                                                                 fVar60 * auVar66._0_4_)))),auVar89,
                            ZEXT1632(auVar230));
  auVar14 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar230));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar108._12_4_,
                                               CONCAT48(fVar118 * auVar108._8_4_,
                                                        CONCAT44(fVar92 * auVar108._4_4_,
                                                                 fVar60 * auVar108._0_4_)))),auVar89
                            ,ZEXT1632(auVar65));
  auVar15 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar65));
  fStack_2fc = auVar15._28_4_;
  auVar240._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  auVar240._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar240._8_4_ = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar240._12_4_ = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar240._16_4_ = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar240._20_4_ = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar240._24_4_ = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar240._28_4_ = 0;
  local_318._0_4_ = fStack_e0 * auVar15._0_4_ * 3.0;
  local_318._4_4_ = fStack_e0 * auVar15._4_4_ * 3.0;
  fStack_310 = fStack_e0 * auVar15._8_4_ * 3.0;
  fStack_30c = fStack_e0 * auVar15._12_4_ * 3.0;
  fStack_308 = fStack_e0 * auVar15._16_4_ * 3.0;
  fStack_304 = fStack_e0 * auVar15._20_4_ * 3.0;
  fStack_300 = fStack_e0 * auVar15._24_4_ * 3.0;
  fVar63 = auVar10._0_4_;
  fVar143 = auVar10._4_4_;
  auVar21._4_4_ = fVar143 * fVar92;
  auVar21._0_4_ = fVar63 * fVar60;
  auVar21._8_4_ = fVar63 * fVar118;
  auVar21._12_4_ = fVar143 * fVar93;
  auVar21._16_4_ = fVar63 * 0.0;
  auVar21._20_4_ = fVar143 * 0.0;
  auVar21._24_4_ = fVar63 * 0.0;
  auVar21._28_4_ = fStack_2fc;
  auVar10 = vfmadd231ps_fma(auVar21,auVar89,local_4a8);
  fVar63 = auVar262._0_4_;
  auVar22._4_4_ = fVar61 * fVar92;
  auVar22._0_4_ = fVar63 * fVar60;
  auVar22._8_4_ = fVar63 * fVar118;
  auVar22._12_4_ = fVar61 * fVar93;
  auVar22._16_4_ = fVar63 * 0.0;
  auVar22._20_4_ = fVar61 * 0.0;
  auVar22._24_4_ = fVar63 * 0.0;
  auVar22._28_4_ = 0;
  auVar262 = vfmadd231ps_fma(auVar22,auVar89,_local_538);
  fVar61 = auVar13._0_4_;
  fVar63 = auVar13._4_4_;
  auVar23._4_4_ = fVar63 * fVar92;
  auVar23._0_4_ = fVar61 * fVar60;
  auVar23._8_4_ = fVar61 * fVar118;
  auVar23._12_4_ = fVar63 * fVar93;
  auVar23._16_4_ = fVar61 * 0.0;
  auVar23._20_4_ = fVar63 * 0.0;
  auVar23._24_4_ = fVar61 * 0.0;
  auVar23._28_4_ = auVar14._28_4_;
  auVar13 = vfmadd231ps_fma(auVar23,auVar89,auVar188);
  fVar61 = auVar11._0_4_;
  fVar214 = auVar11._4_4_;
  auVar24._4_4_ = fVar214 * fVar92;
  auVar24._0_4_ = fVar61 * fVar60;
  auVar24._8_4_ = fVar61 * fVar118;
  auVar24._12_4_ = fVar214 * fVar93;
  auVar24._16_4_ = fVar61 * 0.0;
  auVar24._20_4_ = fVar214 * 0.0;
  auVar24._24_4_ = fVar61 * 0.0;
  auVar24._28_4_ = fVar143;
  auVar11 = vfmadd231ps_fma(auVar24,auVar89,local_368);
  local_368 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar96));
  fVar61 = auVar12._0_4_;
  fVar63 = auVar12._4_4_;
  auVar25._4_4_ = fVar63 * fVar92;
  auVar25._0_4_ = fVar61 * fVar60;
  auVar25._8_4_ = fVar61 * fVar118;
  auVar25._12_4_ = fVar63 * fVar93;
  auVar25._16_4_ = fVar61 * 0.0;
  auVar25._20_4_ = fVar63 * 0.0;
  auVar25._24_4_ = fVar61 * 0.0;
  auVar25._28_4_ = fVar63;
  auVar12 = vfmadd231ps_fma(auVar25,auVar89,auVar175);
  auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar66));
  fVar61 = auVar235._0_4_;
  fVar63 = auVar235._4_4_;
  auVar26._4_4_ = fVar63 * fVar92;
  auVar26._0_4_ = fVar61 * fVar60;
  auVar26._8_4_ = fVar61 * fVar118;
  auVar26._12_4_ = fVar63 * fVar93;
  auVar26._16_4_ = fVar61 * 0.0;
  auVar26._20_4_ = fVar63 * 0.0;
  auVar26._24_4_ = fVar61 * 0.0;
  auVar26._28_4_ = fVar63;
  auVar235 = vfmadd231ps_fma(auVar26,auVar89,auVar266);
  auVar27._28_4_ = fVar214;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar13._12_4_ * fVar93,
                          CONCAT48(auVar13._8_4_ * fVar118,
                                   CONCAT44(auVar13._4_4_ * fVar92,auVar13._0_4_ * fVar60))));
  auVar10 = vfmadd231ps_fma(auVar27,auVar89,ZEXT1632(auVar10));
  auVar262 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar11._12_4_,
                                                CONCAT48(fVar118 * auVar11._8_4_,
                                                         CONCAT44(fVar92 * auVar11._4_4_,
                                                                  fVar60 * auVar11._0_4_)))),auVar89
                             ,ZEXT1632(auVar262));
  local_4a8._0_4_ = auVar96._0_4_ + auVar240._0_4_;
  local_4a8._4_4_ = auVar96._4_4_ + auVar240._4_4_;
  local_4a8._8_4_ = auVar96._8_4_ + auVar240._8_4_;
  local_4a8._12_4_ = auVar96._12_4_ + auVar240._12_4_;
  local_4a8._16_4_ = auVar240._16_4_ + 0.0;
  local_4a8._20_4_ = auVar240._20_4_ + 0.0;
  local_4a8._24_4_ = auVar240._24_4_ + 0.0;
  local_4a8._28_4_ = 0;
  auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar93,
                                               CONCAT48(auVar12._8_4_ * fVar118,
                                                        CONCAT44(auVar12._4_4_ * fVar92,
                                                                 auVar12._0_4_ * fVar60)))),auVar89,
                            ZEXT1632(auVar13));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar235._12_4_ * fVar93,
                                               CONCAT48(auVar235._8_4_ * fVar118,
                                                        CONCAT44(auVar235._4_4_ * fVar92,
                                                                 auVar235._0_4_ * fVar60)))),auVar89
                            ,ZEXT1632(auVar11));
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar13._12_4_,
                                               CONCAT48(fVar118 * auVar13._8_4_,
                                                        CONCAT44(fVar92 * auVar13._4_4_,
                                                                 fVar60 * auVar13._0_4_)))),auVar89,
                            ZEXT1632(auVar10));
  auVar235 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar93,
                                                CONCAT48(auVar11._8_4_ * fVar118,
                                                         CONCAT44(auVar11._4_4_ * fVar92,
                                                                  auVar11._0_4_ * fVar60)))),
                             ZEXT1632(auVar262),auVar89);
  auVar89 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar14 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar262));
  auVar259._0_4_ = fStack_e0 * auVar89._0_4_ * 3.0;
  auVar259._4_4_ = fStack_e0 * auVar89._4_4_ * 3.0;
  auVar259._8_4_ = fStack_e0 * auVar89._8_4_ * 3.0;
  auVar259._12_4_ = fStack_e0 * auVar89._12_4_ * 3.0;
  auVar259._16_4_ = fStack_e0 * auVar89._16_4_ * 3.0;
  auVar259._20_4_ = fStack_e0 * auVar89._20_4_ * 3.0;
  auVar259._24_4_ = fStack_e0 * auVar89._24_4_ * 3.0;
  auVar259._28_4_ = 0;
  local_f8 = fStack_e0 * auVar14._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar28._4_4_ = fStack_f4;
  auVar28._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar28._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar28._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar28._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar28._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar28._24_4_ = fStack_e0;
  auVar28._28_4_ = 0x40400000;
  _local_2f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar12));
  local_1d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar235));
  auVar89 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar96));
  auVar14 = vsubps_avx(ZEXT1632(auVar235),ZEXT1632(auVar66));
  auVar15 = vsubps_avx(_local_2f8,local_368);
  fVar176 = auVar89._0_4_ + auVar15._0_4_;
  fVar190 = auVar89._4_4_ + auVar15._4_4_;
  fVar191 = auVar89._8_4_ + auVar15._8_4_;
  fVar192 = auVar89._12_4_ + auVar15._12_4_;
  fVar142 = auVar89._16_4_ + auVar15._16_4_;
  fVar160 = auVar89._20_4_ + auVar15._20_4_;
  fVar161 = auVar89._24_4_ + auVar15._24_4_;
  auVar16 = vsubps_avx(local_1d8,auVar17);
  auVar90._0_4_ = auVar14._0_4_ + auVar16._0_4_;
  auVar90._4_4_ = auVar14._4_4_ + auVar16._4_4_;
  auVar90._8_4_ = auVar14._8_4_ + auVar16._8_4_;
  auVar90._12_4_ = auVar14._12_4_ + auVar16._12_4_;
  auVar90._16_4_ = auVar14._16_4_ + auVar16._16_4_;
  auVar90._20_4_ = auVar14._20_4_ + auVar16._20_4_;
  auVar90._24_4_ = auVar14._24_4_ + auVar16._24_4_;
  auVar90._28_4_ = auVar14._28_4_ + auVar16._28_4_;
  local_98 = ZEXT1632(auVar66);
  fVar60 = auVar66._0_4_;
  local_118 = (float)local_318._0_4_ + fVar60;
  fVar92 = auVar66._4_4_;
  fStack_114 = (float)local_318._4_4_ + fVar92;
  fVar118 = auVar66._8_4_;
  fStack_110 = fStack_310 + fVar118;
  fVar93 = auVar66._12_4_;
  fStack_10c = fStack_30c + fVar93;
  fStack_108 = fStack_308 + 0.0;
  fStack_104 = fStack_304 + 0.0;
  fStack_100 = fStack_300 + 0.0;
  local_1f8 = ZEXT1632(auVar96);
  auVar14 = vsubps_avx(local_1f8,auVar240);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar14 = vsubps_avx(local_98,_local_318);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar14);
  local_b8._0_4_ = auVar12._0_4_ + auVar259._0_4_;
  local_b8._4_4_ = auVar12._4_4_ + auVar259._4_4_;
  local_b8._8_4_ = auVar12._8_4_ + auVar259._8_4_;
  local_b8._12_4_ = auVar12._12_4_ + auVar259._12_4_;
  local_b8._16_4_ = auVar259._16_4_ + 0.0;
  local_b8._20_4_ = auVar259._20_4_ + 0.0;
  local_b8._24_4_ = auVar259._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar213 = ZEXT3264(local_b8);
  auVar241 = ZEXT1632(auVar12);
  auVar14 = vsubps_avx(auVar241,auVar259);
  auVar18 = vpermps_avx2(_DAT_01fec480,auVar14);
  fVar61 = auVar235._0_4_;
  local_f8 = fVar61 + local_f8;
  fVar63 = auVar235._4_4_;
  fStack_f4 = fVar63 + fStack_f4;
  fVar143 = auVar235._8_4_;
  fStack_f0 = fVar143 + fStack_f0;
  fVar214 = auVar235._12_4_;
  fStack_ec = fVar214 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar235),auVar28);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar29._4_4_ = fVar92 * fVar190;
  auVar29._0_4_ = fVar60 * fVar176;
  auVar29._8_4_ = fVar118 * fVar191;
  auVar29._12_4_ = fVar93 * fVar192;
  auVar29._16_4_ = fVar142 * 0.0;
  auVar29._20_4_ = fVar160 * 0.0;
  auVar29._24_4_ = fVar161 * 0.0;
  auVar29._28_4_ = auVar14._28_4_;
  auVar13 = vfnmadd231ps_fma(auVar29,local_1f8,auVar90);
  fStack_fc = fStack_2fc + 0.0;
  auVar30._4_4_ = fStack_114 * fVar190;
  auVar30._0_4_ = local_118 * fVar176;
  auVar30._8_4_ = fStack_110 * fVar191;
  auVar30._12_4_ = fStack_10c * fVar192;
  auVar30._16_4_ = fStack_108 * fVar142;
  auVar30._20_4_ = fStack_104 * fVar160;
  auVar30._24_4_ = fStack_100 * fVar161;
  auVar30._28_4_ = 0;
  auVar10 = vfnmadd231ps_fma(auVar30,auVar90,local_4a8);
  auVar31._4_4_ = local_138._4_4_ * fVar190;
  auVar31._0_4_ = local_138._0_4_ * fVar176;
  auVar31._8_4_ = local_138._8_4_ * fVar191;
  auVar31._12_4_ = local_138._12_4_ * fVar192;
  auVar31._16_4_ = local_138._16_4_ * fVar142;
  auVar31._20_4_ = local_138._20_4_ * fVar160;
  auVar31._24_4_ = local_138._24_4_ * fVar161;
  auVar31._28_4_ = fStack_2fc + 0.0;
  auVar262 = vfnmadd231ps_fma(auVar31,local_78,auVar90);
  local_538._0_4_ = auVar17._0_4_;
  local_538._4_4_ = auVar17._4_4_;
  uStack_530._0_4_ = auVar17._8_4_;
  uStack_530._4_4_ = auVar17._12_4_;
  uStack_528._0_4_ = auVar17._16_4_;
  uStack_528._4_4_ = auVar17._20_4_;
  uStack_520._0_4_ = auVar17._24_4_;
  uStack_520._4_4_ = auVar17._28_4_;
  auVar32._4_4_ = (float)local_538._4_4_ * fVar190;
  auVar32._0_4_ = (float)local_538._0_4_ * fVar176;
  auVar32._8_4_ = (float)uStack_530 * fVar191;
  auVar32._12_4_ = uStack_530._4_4_ * fVar192;
  auVar32._16_4_ = (float)uStack_528 * fVar142;
  auVar32._20_4_ = uStack_528._4_4_ * fVar160;
  auVar32._24_4_ = (float)uStack_520 * fVar161;
  auVar32._28_4_ = uStack_520._4_4_;
  auVar11 = vfnmadd231ps_fma(auVar32,local_368,auVar90);
  auVar201._0_4_ = fVar61 * fVar176;
  auVar201._4_4_ = fVar63 * fVar190;
  auVar201._8_4_ = fVar143 * fVar191;
  auVar201._12_4_ = fVar214 * fVar192;
  auVar201._16_4_ = fVar142 * 0.0;
  auVar201._20_4_ = fVar160 * 0.0;
  auVar201._24_4_ = fVar161 * 0.0;
  auVar201._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar201,auVar241,auVar90);
  uStack_dc = 0x40400000;
  auVar33._4_4_ = fStack_f4 * fVar190;
  auVar33._0_4_ = local_f8 * fVar176;
  auVar33._8_4_ = fStack_f0 * fVar191;
  auVar33._12_4_ = fStack_ec * fVar192;
  auVar33._16_4_ = fStack_e8 * fVar142;
  auVar33._20_4_ = fStack_e4 * fVar160;
  auVar33._24_4_ = fStack_e0 * fVar161;
  auVar33._28_4_ = local_368._28_4_;
  auVar66 = vfnmadd231ps_fma(auVar33,local_b8,auVar90);
  auVar34._4_4_ = local_d8._4_4_ * fVar190;
  auVar34._0_4_ = local_d8._0_4_ * fVar176;
  auVar34._8_4_ = local_d8._8_4_ * fVar191;
  auVar34._12_4_ = local_d8._12_4_ * fVar192;
  auVar34._16_4_ = local_d8._16_4_ * fVar142;
  auVar34._20_4_ = local_d8._20_4_ * fVar160;
  auVar34._24_4_ = local_d8._24_4_ * fVar161;
  auVar34._28_4_ = local_d8._28_4_;
  auVar108 = vfnmadd231ps_fma(auVar34,auVar18,auVar90);
  auVar35._4_4_ = local_1d8._4_4_ * fVar190;
  auVar35._0_4_ = local_1d8._0_4_ * fVar176;
  auVar35._8_4_ = local_1d8._8_4_ * fVar191;
  auVar35._12_4_ = local_1d8._12_4_ * fVar192;
  auVar35._16_4_ = local_1d8._16_4_ * fVar142;
  auVar35._20_4_ = local_1d8._20_4_ * fVar160;
  auVar35._24_4_ = local_1d8._24_4_ * fVar161;
  auVar35._28_4_ = auVar89._28_4_ + auVar15._28_4_;
  auVar230 = vfnmadd231ps_fma(auVar35,_local_2f8,auVar90);
  auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar89 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar15 = vminps_avx(ZEXT1632(auVar262),ZEXT1632(auVar11));
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar262),ZEXT1632(auVar11));
  auVar89 = vmaxps_avx(auVar89,auVar14);
  auVar16 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar66));
  auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar66));
  auVar9 = vminps_avx(ZEXT1632(auVar108),ZEXT1632(auVar230));
  auVar16 = vminps_avx(auVar16,auVar9);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(ZEXT1632(auVar108),ZEXT1632(auVar230));
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar89,auVar14);
  auVar49._4_4_ = fStack_194;
  auVar49._0_4_ = local_198;
  auVar49._8_4_ = fStack_190;
  auVar49._12_4_ = fStack_18c;
  auVar49._16_4_ = fStack_188;
  auVar49._20_4_ = fStack_184;
  auVar49._24_4_ = fStack_180;
  auVar49._28_4_ = fStack_17c;
  auVar89 = vcmpps_avx(auVar16,auVar49,2);
  auVar47._4_4_ = uStack_1b4;
  auVar47._0_4_ = local_1b8;
  auVar47._8_4_ = uStack_1b0;
  auVar47._12_4_ = uStack_1ac;
  auVar47._16_4_ = uStack_1a8;
  auVar47._20_4_ = uStack_1a4;
  auVar47._24_4_ = uStack_1a0;
  auVar47._28_4_ = uStack_19c;
  auVar14 = vcmpps_avx(auVar14,auVar47,5);
  auVar89 = vandps_avx(auVar14,auVar89);
  auVar14 = local_158 & auVar89;
  _local_318 = auVar18;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(local_368,local_1f8);
    auVar15 = vsubps_avx(_local_2f8,auVar241);
    fVar190 = auVar14._0_4_ + auVar15._0_4_;
    fVar191 = auVar14._4_4_ + auVar15._4_4_;
    fVar192 = auVar14._8_4_ + auVar15._8_4_;
    fVar142 = auVar14._12_4_ + auVar15._12_4_;
    fVar160 = auVar14._16_4_ + auVar15._16_4_;
    fVar161 = auVar14._20_4_ + auVar15._20_4_;
    fVar250 = auVar14._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(auVar17,local_98);
    auVar9 = vsubps_avx(local_1d8,ZEXT1632(auVar235));
    auVar107._0_4_ = auVar16._0_4_ + auVar9._0_4_;
    auVar107._4_4_ = auVar16._4_4_ + auVar9._4_4_;
    auVar107._8_4_ = auVar16._8_4_ + auVar9._8_4_;
    auVar107._12_4_ = auVar16._12_4_ + auVar9._12_4_;
    auVar107._16_4_ = auVar16._16_4_ + auVar9._16_4_;
    auVar107._20_4_ = auVar16._20_4_ + auVar9._20_4_;
    auVar107._24_4_ = auVar16._24_4_ + auVar9._24_4_;
    fVar176 = auVar9._28_4_;
    auVar107._28_4_ = auVar16._28_4_ + fVar176;
    auVar36._4_4_ = fVar92 * fVar191;
    auVar36._0_4_ = fVar60 * fVar190;
    auVar36._8_4_ = fVar118 * fVar192;
    auVar36._12_4_ = fVar93 * fVar142;
    auVar36._16_4_ = fVar160 * 0.0;
    auVar36._20_4_ = fVar161 * 0.0;
    auVar36._24_4_ = fVar250 * 0.0;
    auVar36._28_4_ = local_2f8._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar36,auVar107,local_1f8);
    auVar37._4_4_ = fVar191 * fStack_114;
    auVar37._0_4_ = fVar190 * local_118;
    auVar37._8_4_ = fVar192 * fStack_110;
    auVar37._12_4_ = fVar142 * fStack_10c;
    auVar37._16_4_ = fVar160 * fStack_108;
    auVar37._20_4_ = fVar161 * fStack_104;
    auVar37._24_4_ = fVar250 * fStack_100;
    auVar37._28_4_ = 0;
    auVar13 = vfnmadd213ps_fma(local_4a8,auVar107,auVar37);
    auVar38._4_4_ = fVar191 * local_138._4_4_;
    auVar38._0_4_ = fVar190 * local_138._0_4_;
    auVar38._8_4_ = fVar192 * local_138._8_4_;
    auVar38._12_4_ = fVar142 * local_138._12_4_;
    auVar38._16_4_ = fVar160 * local_138._16_4_;
    auVar38._20_4_ = fVar161 * local_138._20_4_;
    auVar38._24_4_ = fVar250 * local_138._24_4_;
    auVar38._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_78,auVar107,auVar38);
    auVar39._4_4_ = (float)local_538._4_4_ * fVar191;
    auVar39._0_4_ = (float)local_538._0_4_ * fVar190;
    auVar39._8_4_ = (float)uStack_530 * fVar192;
    auVar39._12_4_ = uStack_530._4_4_ * fVar142;
    auVar39._16_4_ = (float)uStack_528 * fVar160;
    auVar39._20_4_ = uStack_528._4_4_ * fVar161;
    auVar39._24_4_ = (float)uStack_520 * fVar250;
    auVar39._28_4_ = 0;
    auVar235 = vfnmadd231ps_fma(auVar39,auVar107,local_368);
    auVar129._0_4_ = fVar61 * fVar190;
    auVar129._4_4_ = fVar63 * fVar191;
    auVar129._8_4_ = fVar143 * fVar192;
    auVar129._12_4_ = fVar214 * fVar142;
    auVar129._16_4_ = fVar160 * 0.0;
    auVar129._20_4_ = fVar161 * 0.0;
    auVar129._24_4_ = fVar250 * 0.0;
    auVar129._28_4_ = 0;
    auVar66 = vfnmadd231ps_fma(auVar129,auVar107,auVar241);
    auVar40._4_4_ = fVar191 * fStack_f4;
    auVar40._0_4_ = fVar190 * local_f8;
    auVar40._8_4_ = fVar192 * fStack_f0;
    auVar40._12_4_ = fVar142 * fStack_ec;
    auVar40._16_4_ = fVar160 * fStack_e8;
    auVar40._20_4_ = fVar161 * fStack_e4;
    auVar40._24_4_ = fVar250 * fStack_e0;
    auVar40._28_4_ = fVar176;
    auVar262 = vfnmadd213ps_fma(local_b8,auVar107,auVar40);
    auVar41._4_4_ = fVar191 * local_d8._4_4_;
    auVar41._0_4_ = fVar190 * local_d8._0_4_;
    auVar41._8_4_ = fVar192 * local_d8._8_4_;
    auVar41._12_4_ = fVar142 * local_d8._12_4_;
    auVar41._16_4_ = fVar160 * local_d8._16_4_;
    auVar41._20_4_ = fVar161 * local_d8._20_4_;
    auVar41._24_4_ = fVar250 * local_d8._24_4_;
    auVar41._28_4_ = fVar176;
    auVar11 = vfnmadd213ps_fma(auVar18,auVar107,auVar41);
    auVar213 = ZEXT1664(auVar11);
    auVar42._4_4_ = local_1d8._4_4_ * fVar191;
    auVar42._0_4_ = local_1d8._0_4_ * fVar190;
    auVar42._8_4_ = local_1d8._8_4_ * fVar192;
    auVar42._12_4_ = local_1d8._12_4_ * fVar142;
    auVar42._16_4_ = local_1d8._16_4_ * fVar160;
    auVar42._20_4_ = local_1d8._20_4_ * fVar161;
    auVar42._24_4_ = local_1d8._24_4_ * fVar250;
    auVar42._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar108 = vfnmadd231ps_fma(auVar42,_local_2f8,auVar107);
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
    auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar235));
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar235));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar9 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar262));
    auVar15 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar262));
    auVar17 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar108));
    auVar9 = vminps_avx(auVar9,auVar17);
    auVar9 = vminps_avx(auVar16,auVar9);
    auVar16 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar108));
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar14 = vcmpps_avx(auVar9,auVar50,2);
    auVar48._4_4_ = uStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = uStack_1b0;
    auVar48._12_4_ = uStack_1ac;
    auVar48._16_4_ = uStack_1a8;
    auVar48._20_4_ = uStack_1a4;
    auVar48._24_4_ = uStack_1a0;
    auVar48._28_4_ = uStack_19c;
    auVar15 = vcmpps_avx(auVar15,auVar48,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar89 = vandps_avx(local_158,auVar89);
    auVar15 = auVar89 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar89 = vandps_avx(auVar14,auVar89);
      uVar56 = vmovmskps_avx(auVar89);
      if (uVar56 != 0) {
        uVar58 = (ulong)uVar51;
        auStack_2d8[uVar58] = uVar56 & 0xff;
        uVar94 = vmovlps_avx(local_248);
        *(undefined8 *)(&uStack_178 + uVar58 * 2) = uVar94;
        uVar52 = vmovlps_avx(auVar77);
        auStack_58[uVar58] = uVar52;
        uVar51 = uVar51 + 1;
      }
    }
  }
LAB_015cff57:
  if (uVar51 != 0) {
    uVar58 = (ulong)(uVar51 - 1);
    uVar55 = auStack_2d8[uVar58];
    uVar56 = (&uStack_178)[uVar58 * 2];
    fVar60 = afStack_174[uVar58 * 2];
    iVar19 = 0;
    for (uVar52 = (ulong)uVar55; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      iVar19 = iVar19 + 1;
    }
    uVar55 = uVar55 - 1 & uVar55;
    if (uVar55 == 0) {
      uVar51 = uVar51 - 1;
    }
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_58[uVar58];
    auStack_2d8[uVar58] = uVar55;
    fVar92 = (float)(iVar19 + 1) * 0.14285715;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * (float)iVar19 * 0.14285715)),ZEXT416(uVar56),
                              ZEXT416((uint)(1.0 - (float)iVar19 * 0.14285715)));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar92)),ZEXT416(uVar56),
                              ZEXT416((uint)(1.0 - fVar92)));
    fVar92 = auVar10._0_4_;
    auVar189._0_4_ = auVar13._0_4_;
    fVar60 = fVar92 - auVar189._0_4_;
    if (fVar60 < 0.16666667) {
      auVar262 = vshufps_avx(auVar77,auVar77,0x50);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar11 = vsubps_avx(auVar98,auVar262);
      fVar118 = auVar262._0_4_;
      auVar136._0_4_ = fVar118 * (float)local_3c8._0_4_;
      fVar93 = auVar262._4_4_;
      auVar136._4_4_ = fVar93 * (float)local_3c8._4_4_;
      fVar61 = auVar262._8_4_;
      auVar136._8_4_ = fVar61 * fStack_3c0;
      fVar63 = auVar262._12_4_;
      auVar136._12_4_ = fVar63 * fStack_3bc;
      auVar151._0_4_ = fVar162 * fVar118;
      auVar151._4_4_ = fVar242 * fVar93;
      auVar151._8_4_ = fVar162 * fVar61;
      auVar151._12_4_ = fVar242 * fVar63;
      auVar172._0_4_ = fVar118 * (float)local_3d8._0_4_;
      auVar172._4_4_ = fVar93 * (float)local_3d8._4_4_;
      auVar172._8_4_ = fVar61 * fStack_3d0;
      auVar172._12_4_ = fVar63 * fStack_3cc;
      auVar79._0_4_ = fVar118 * (float)local_3e8._0_4_;
      auVar79._4_4_ = fVar93 * (float)local_3e8._4_4_;
      auVar79._8_4_ = fVar61 * fStack_3e0;
      auVar79._12_4_ = fVar63 * fStack_3dc;
      auVar262 = vfmadd231ps_fma(auVar136,auVar11,local_388);
      auVar12 = vfmadd231ps_fma(auVar151,auVar11,local_398);
      auVar235 = vfmadd231ps_fma(auVar172,auVar11,local_3a8);
      auVar11 = vfmadd231ps_fma(auVar79,auVar11,local_3b8);
      auVar130._16_16_ = auVar262;
      auVar130._0_16_ = auVar262;
      auVar141._16_16_ = auVar12;
      auVar141._0_16_ = auVar12;
      auVar159._16_16_ = auVar235;
      auVar159._0_16_ = auVar235;
      auVar189._4_4_ = auVar189._0_4_;
      auVar189._8_4_ = auVar189._0_4_;
      auVar189._12_4_ = auVar189._0_4_;
      local_4a8._0_16_ = auVar10;
      auVar189._20_4_ = fVar92;
      auVar189._16_4_ = fVar92;
      auVar189._24_4_ = fVar92;
      auVar189._28_4_ = fVar92;
      auVar89 = vsubps_avx(auVar141,auVar130);
      auVar12 = vfmadd213ps_fma(auVar89,auVar189,auVar130);
      auVar89 = vsubps_avx(auVar159,auVar141);
      auVar66 = vfmadd213ps_fma(auVar89,auVar189,auVar141);
      auVar262 = vsubps_avx(auVar11,auVar235);
      auVar91._16_16_ = auVar262;
      auVar91._0_16_ = auVar262;
      auVar262 = vfmadd213ps_fma(auVar91,auVar189,auVar159);
      auVar89 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar12));
      auVar11 = vfmadd213ps_fma(auVar89,auVar189,ZEXT1632(auVar12));
      auVar89 = vsubps_avx(ZEXT1632(auVar262),ZEXT1632(auVar66));
      auVar262 = vfmadd213ps_fma(auVar89,auVar189,ZEXT1632(auVar66));
      auVar89 = vsubps_avx(ZEXT1632(auVar262),ZEXT1632(auVar11));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar89,auVar189);
      fVar214 = auVar89._4_4_ * 3.0;
      local_368._0_4_ = fVar60;
      fVar118 = fVar60 * 0.33333334;
      local_1d8._0_8_ =
           CONCAT44(auVar65._4_4_ + fVar118 * fVar214,auVar65._0_4_ + fVar118 * auVar89._0_4_ * 3.0)
      ;
      local_1d8._8_4_ = auVar65._8_4_ + fVar118 * auVar89._8_4_ * 3.0;
      local_1d8._12_4_ = auVar65._12_4_ + fVar118 * auVar89._12_4_ * 3.0;
      auVar11 = vshufpd_avx(auVar65,auVar65,3);
      auVar12 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_318 = auVar11;
      auVar262 = vsubps_avx(auVar11,auVar65);
      _local_2f8 = auVar12;
      auVar235 = vsubps_avx(auVar12,(undefined1  [16])0x0);
      auVar80._0_4_ = auVar262._0_4_ + auVar235._0_4_;
      auVar80._4_4_ = auVar262._4_4_ + auVar235._4_4_;
      auVar80._8_4_ = auVar262._8_4_ + auVar235._8_4_;
      auVar80._12_4_ = auVar262._12_4_ + auVar235._12_4_;
      auVar262 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar235 = vshufps_avx(local_1d8._0_16_,local_1d8._0_16_,0xb1);
      auVar255._4_4_ = auVar80._0_4_;
      auVar255._0_4_ = auVar80._0_4_;
      auVar255._8_4_ = auVar80._0_4_;
      auVar255._12_4_ = auVar80._0_4_;
      auVar66 = vshufps_avx(auVar80,auVar80,0x55);
      fVar93 = auVar66._0_4_;
      auVar81._0_4_ = fVar93 * auVar262._0_4_;
      fVar61 = auVar66._4_4_;
      auVar81._4_4_ = fVar61 * auVar262._4_4_;
      fVar63 = auVar66._8_4_;
      auVar81._8_4_ = fVar63 * auVar262._8_4_;
      fVar143 = auVar66._12_4_;
      auVar81._12_4_ = fVar143 * auVar262._12_4_;
      auVar152._0_4_ = fVar93 * auVar235._0_4_;
      auVar152._4_4_ = fVar61 * auVar235._4_4_;
      auVar152._8_4_ = fVar63 * auVar235._8_4_;
      auVar152._12_4_ = fVar143 * auVar235._12_4_;
      auVar108 = vfmadd231ps_fma(auVar81,auVar255,auVar65);
      auVar230 = vfmadd231ps_fma(auVar152,auVar255,local_1d8._0_16_);
      auVar235 = vshufps_avx(auVar108,auVar108,0xe8);
      auVar66 = vshufps_avx(auVar230,auVar230,0xe8);
      auVar262 = vcmpps_avx(auVar235,auVar66,1);
      uVar56 = vextractps_avx(auVar262,0);
      auVar96 = auVar230;
      if ((uVar56 & 1) == 0) {
        auVar96 = auVar108;
      }
      auVar122._0_4_ = fVar118 * auVar89._16_4_ * 3.0;
      auVar122._4_4_ = fVar118 * fVar214;
      auVar122._8_4_ = fVar118 * auVar89._24_4_ * 3.0;
      auVar122._12_4_ = fVar118 * auVar213._28_4_;
      local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar122);
      auVar123 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
      auVar132 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar181._0_4_ = fVar93 * auVar123._0_4_;
      auVar181._4_4_ = fVar61 * auVar123._4_4_;
      auVar181._8_4_ = fVar63 * auVar123._8_4_;
      auVar181._12_4_ = fVar143 * auVar123._12_4_;
      auVar197._0_4_ = auVar132._0_4_ * fVar93;
      auVar197._4_4_ = auVar132._4_4_ * fVar61;
      auVar197._8_4_ = auVar132._8_4_ * fVar63;
      auVar197._12_4_ = auVar132._12_4_ * fVar143;
      auVar95 = vfmadd231ps_fma(auVar181,auVar255,local_1f8._0_16_);
      auVar131 = vfmadd231ps_fma(auVar197,(undefined1  [16])0x0,auVar255);
      auVar132 = vshufps_avx(auVar95,auVar95,0xe8);
      auVar64 = vshufps_avx(auVar131,auVar131,0xe8);
      auVar213 = ZEXT1664(auVar64);
      auVar123 = vcmpps_avx(auVar132,auVar64,1);
      uVar56 = vextractps_avx(auVar123,0);
      auVar144 = auVar131;
      if ((uVar56 & 1) == 0) {
        auVar144 = auVar95;
      }
      auVar96 = vmaxss_avx(auVar144,auVar96);
      auVar235 = vminps_avx(auVar235,auVar66);
      auVar66 = vminps_avx(auVar132,auVar64);
      auVar66 = vminps_avx(auVar235,auVar66);
      auVar262 = vshufps_avx(auVar262,auVar262,0x55);
      auVar262 = vblendps_avx(auVar262,auVar123,2);
      auVar123 = vpslld_avx(auVar262,0x1f);
      auVar262 = vshufpd_avx(auVar230,auVar230,1);
      auVar262 = vinsertps_avx(auVar262,auVar131,0x9c);
      auVar235 = vshufpd_avx(auVar108,auVar108,1);
      auVar235 = vinsertps_avx(auVar235,auVar95,0x9c);
      auVar262 = vblendvps_avx(auVar235,auVar262,auVar123);
      auVar235 = vmovshdup_avx(auVar262);
      auVar262 = vmaxss_avx(auVar235,auVar262);
      fVar63 = auVar66._0_4_;
      auVar235 = vmovshdup_avx(auVar66);
      fVar61 = auVar262._0_4_;
      fVar118 = auVar235._0_4_;
      fVar93 = auVar96._0_4_;
      if (((0.0001 <= fVar63) || (fVar61 <= -0.0001)) && (0.0001 <= fVar118 || fVar61 <= -0.0001))
      goto code_r0x015d026b;
      goto LAB_015d0291;
    }
    local_248 = vinsertps_avx(auVar13,auVar10,0x10);
    goto LAB_015cf9dd;
  }
  if (bVar57) {
    return bVar57;
  }
  fVar60 = ray->tfar;
  auVar88._4_4_ = fVar60;
  auVar88._0_4_ = fVar60;
  auVar88._8_4_ = fVar60;
  auVar88._12_4_ = fVar60;
  auVar13 = vcmpps_avx(local_258,auVar88,2);
  uVar51 = vmovmskps_avx(auVar13);
  uVar51 = (uint)uVar59 & uVar51;
  if (uVar51 == 0) {
    return bVar57;
  }
  goto LAB_015cf237;
code_r0x015d026b:
  auVar235 = vcmpps_avx(auVar235,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar108 = vcmpps_avx(auVar66,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar235 = vandps_avx(auVar108,auVar235);
  if (fVar93 <= -0.0001 || (auVar235 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015cff57;
LAB_015d0291:
  auVar108 = vcmpps_avx(auVar66,_DAT_01f7aa10,1);
  auVar230 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar235 = vcmpss_avx(auVar96,ZEXT816(0) << 0x20,1);
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar235 = vblendvps_avx(auVar98,auVar110,auVar235);
  auVar108 = vblendvps_avx(auVar98,auVar110,auVar108);
  fVar214 = auVar108._0_4_;
  fVar143 = auVar235._0_4_;
  auVar235 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar214 == fVar143) && (!NAN(fVar214) && !NAN(fVar143))) {
    auVar235 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar214 == fVar143) && (!NAN(fVar214) && !NAN(fVar143))) {
    auVar230 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar108 = vmovshdup_avx(auVar108);
  fVar176 = auVar108._0_4_;
  if ((fVar214 != fVar176) || (NAN(fVar214) || NAN(fVar176))) {
    auVar182._12_4_ = 0;
    auVar182._0_12_ = ZEXT812(0);
    auVar182 = auVar182 << 0x20;
    if ((fVar118 != fVar63) || (NAN(fVar118) || NAN(fVar63))) {
      auVar124._0_4_ = (float)((uint)fVar63 ^ local_408);
      auVar124._4_4_ = auVar66._4_4_ ^ uStack_404;
      auVar124._8_4_ = auVar66._8_4_ ^ uStack_400;
      auVar124._12_4_ = auVar66._12_4_ ^ uStack_3fc;
      auVar125._0_4_ = auVar124._0_4_ / (fVar118 - fVar63);
      auVar125._4_12_ = auVar124._4_12_;
      auVar66 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar182,auVar125);
      auVar108 = auVar66;
    }
    else {
      auVar66 = ZEXT816(0) << 0x20;
      if ((fVar63 != 0.0) || (auVar108 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar63))) {
        auVar66 = SUB6416(ZEXT464(0x7f800000),0);
        auVar108 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar235 = vminss_avx(auVar235,auVar66);
    auVar230 = vmaxss_avx(auVar108,auVar230);
  }
  else {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = ZEXT812(0);
    auVar182 = auVar43 << 0x20;
  }
  auVar262 = vcmpss_avx(auVar262,auVar182,1);
  auVar111._8_4_ = 0xbf800000;
  auVar111._0_8_ = 0xbf800000bf800000;
  auVar111._12_4_ = 0xbf800000;
  auVar262 = vblendvps_avx(auVar98,auVar111,auVar262);
  fVar118 = auVar262._0_4_;
  auVar262 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar143 != fVar118) || (NAN(fVar143) || NAN(fVar118))) {
    if ((fVar61 != fVar93) || (NAN(fVar61) || NAN(fVar93))) {
      auVar82._0_4_ = (float)((uint)fVar93 ^ local_408);
      auVar82._4_4_ = auVar96._4_4_ ^ uStack_404;
      auVar82._8_4_ = auVar96._8_4_ ^ uStack_400;
      auVar82._12_4_ = auVar96._12_4_ ^ uStack_3fc;
      auVar126._0_4_ = auVar82._0_4_ / (fVar61 - fVar93);
      auVar126._4_12_ = auVar82._4_12_;
      auVar66 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar182,auVar126);
      auVar108 = auVar66;
    }
    else {
      auVar66 = ZEXT816(0) << 0x20;
      if ((fVar93 != 0.0) || (auVar108 = auVar262, NAN(fVar93))) {
        auVar66 = SUB6416(ZEXT464(0x7f800000),0);
        auVar108 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar235 = vminss_avx(auVar235,auVar66);
    auVar230 = vmaxss_avx(auVar108,auVar230);
  }
  if ((fVar176 != fVar118) || (NAN(fVar176) || NAN(fVar118))) {
    auVar235 = vminss_avx(auVar235,auVar262);
    auVar230 = vmaxss_avx(auVar262,auVar230);
  }
  auVar235 = vmaxss_avx(auVar182,auVar235);
  auVar66 = vminss_avx(auVar230,auVar262);
  if (auVar66._0_4_ < auVar235._0_4_) goto LAB_015cff57;
  auVar235 = vmaxss_avx(auVar182,ZEXT416((uint)(auVar235._0_4_ + -0.1)));
  auVar262 = vminss_avx(ZEXT416((uint)(auVar66._0_4_ + 0.1)),auVar262);
  auVar137._0_8_ = auVar65._0_8_;
  auVar137._8_8_ = auVar137._0_8_;
  auVar205._8_8_ = local_1d8._0_8_;
  auVar205._0_8_ = local_1d8._0_8_;
  auVar219._8_8_ = local_1f8._0_8_;
  auVar219._0_8_ = local_1f8._0_8_;
  auVar66 = vshufpd_avx(local_1d8._0_16_,local_1d8._0_16_,3);
  auVar108 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
  auVar230 = vshufps_avx(auVar235,auVar262,0);
  auVar65 = vsubps_avx(auVar98,auVar230);
  local_318._0_4_ = auVar11._0_4_;
  local_318._4_4_ = auVar11._4_4_;
  fStack_310 = auVar11._8_4_;
  fStack_30c = auVar11._12_4_;
  fVar118 = auVar230._0_4_;
  auVar83._0_4_ = fVar118 * (float)local_318._0_4_;
  fVar93 = auVar230._4_4_;
  auVar83._4_4_ = fVar93 * (float)local_318._4_4_;
  fVar61 = auVar230._8_4_;
  auVar83._8_4_ = fVar61 * fStack_310;
  fVar63 = auVar230._12_4_;
  auVar83._12_4_ = fVar63 * fStack_30c;
  auVar173._0_4_ = fVar118 * auVar66._0_4_;
  auVar173._4_4_ = fVar93 * auVar66._4_4_;
  auVar173._8_4_ = fVar61 * auVar66._8_4_;
  auVar173._12_4_ = fVar63 * auVar66._12_4_;
  auVar183._0_4_ = fVar118 * auVar108._0_4_;
  auVar183._4_4_ = fVar93 * auVar108._4_4_;
  auVar183._8_4_ = fVar61 * auVar108._8_4_;
  auVar183._12_4_ = fVar63 * auVar108._12_4_;
  local_2f8._0_4_ = auVar12._0_4_;
  local_2f8._4_4_ = auVar12._4_4_;
  fStack_2f0 = auVar12._8_4_;
  fStack_2ec = auVar12._12_4_;
  auVar198._0_4_ = fVar118 * (float)local_2f8._0_4_;
  auVar198._4_4_ = fVar93 * (float)local_2f8._4_4_;
  auVar198._8_4_ = fVar61 * fStack_2f0;
  auVar198._12_4_ = fVar63 * fStack_2ec;
  auVar66 = vfmadd231ps_fma(auVar83,auVar65,auVar137);
  auVar108 = vfmadd231ps_fma(auVar173,auVar65,auVar205);
  auVar230 = vfmadd231ps_fma(auVar183,auVar65,auVar219);
  auVar65 = vfmadd231ps_fma(auVar198,auVar65,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar77);
  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar235._0_4_)),auVar77,
                            ZEXT416((uint)(1.0 - auVar235._0_4_)));
  auVar131 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar262._0_4_)),auVar77,
                             ZEXT416((uint)(1.0 - auVar262._0_4_)));
  fVar118 = 1.0 / fVar60;
  auVar262 = vsubps_avx(auVar108,auVar66);
  auVar206._0_4_ = auVar262._0_4_ * 3.0;
  auVar206._4_4_ = auVar262._4_4_ * 3.0;
  auVar206._8_4_ = auVar262._8_4_ * 3.0;
  auVar206._12_4_ = auVar262._12_4_ * 3.0;
  auVar262 = vsubps_avx(auVar230,auVar108);
  auVar220._0_4_ = auVar262._0_4_ * 3.0;
  auVar220._4_4_ = auVar262._4_4_ * 3.0;
  auVar220._8_4_ = auVar262._8_4_ * 3.0;
  auVar220._12_4_ = auVar262._12_4_ * 3.0;
  auVar262 = vsubps_avx(auVar65,auVar230);
  auVar231._0_4_ = auVar262._0_4_ * 3.0;
  auVar231._4_4_ = auVar262._4_4_ * 3.0;
  auVar231._8_4_ = auVar262._8_4_ * 3.0;
  auVar231._12_4_ = auVar262._12_4_ * 3.0;
  auVar11 = vminps_avx(auVar220,auVar231);
  auVar262 = vmaxps_avx(auVar220,auVar231);
  auVar11 = vminps_avx(auVar206,auVar11);
  auVar262 = vmaxps_avx(auVar206,auVar262);
  auVar12 = vshufpd_avx(auVar11,auVar11,3);
  auVar235 = vshufpd_avx(auVar262,auVar262,3);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar262 = vmaxps_avx(auVar262,auVar235);
  auVar221._0_4_ = auVar11._0_4_ * fVar118;
  auVar221._4_4_ = auVar11._4_4_ * fVar118;
  auVar221._8_4_ = auVar11._8_4_ * fVar118;
  auVar221._12_4_ = auVar11._12_4_ * fVar118;
  auVar207._0_4_ = auVar262._0_4_ * fVar118;
  auVar207._4_4_ = auVar262._4_4_ * fVar118;
  auVar207._8_4_ = auVar262._8_4_ * fVar118;
  auVar207._12_4_ = auVar262._12_4_ * fVar118;
  fVar118 = 1.0 / (auVar131._0_4_ - auVar95._0_4_);
  auVar262 = vshufpd_avx(auVar66,auVar66,3);
  auVar11 = vshufpd_avx(auVar108,auVar108,3);
  auVar12 = vshufpd_avx(auVar230,auVar230,3);
  auVar235 = vshufpd_avx(auVar65,auVar65,3);
  auVar262 = vsubps_avx(auVar262,auVar66);
  auVar66 = vsubps_avx(auVar11,auVar108);
  auVar108 = vsubps_avx(auVar12,auVar230);
  auVar235 = vsubps_avx(auVar235,auVar65);
  auVar11 = vminps_avx(auVar262,auVar66);
  auVar262 = vmaxps_avx(auVar262,auVar66);
  auVar12 = vminps_avx(auVar108,auVar235);
  auVar12 = vminps_avx(auVar11,auVar12);
  auVar11 = vmaxps_avx(auVar108,auVar235);
  auVar262 = vmaxps_avx(auVar262,auVar11);
  auVar244._0_4_ = fVar118 * auVar12._0_4_;
  auVar244._4_4_ = fVar118 * auVar12._4_4_;
  auVar244._8_4_ = fVar118 * auVar12._8_4_;
  auVar244._12_4_ = fVar118 * auVar12._12_4_;
  auVar236._0_4_ = fVar118 * auVar262._0_4_;
  auVar236._4_4_ = fVar118 * auVar262._4_4_;
  auVar236._8_4_ = fVar118 * auVar262._8_4_;
  auVar236._12_4_ = fVar118 * auVar262._12_4_;
  auVar235 = vinsertps_avx(auVar13,auVar95,0x10);
  auVar66 = vinsertps_avx(auVar10,auVar131,0x10);
  auVar232._0_4_ = (auVar235._0_4_ + auVar66._0_4_) * 0.5;
  auVar232._4_4_ = (auVar235._4_4_ + auVar66._4_4_) * 0.5;
  auVar232._8_4_ = (auVar235._8_4_ + auVar66._8_4_) * 0.5;
  auVar232._12_4_ = (auVar235._12_4_ + auVar66._12_4_) * 0.5;
  auVar84._4_4_ = auVar232._0_4_;
  auVar84._0_4_ = auVar232._0_4_;
  auVar84._8_4_ = auVar232._0_4_;
  auVar84._12_4_ = auVar232._0_4_;
  auVar262 = vfmadd213ps_fma(local_208,auVar84,local_488);
  auVar11 = vfmadd213ps_fma(local_218,auVar84,local_4e8);
  auVar12 = vfmadd213ps_fma(local_228,auVar84,local_4f8);
  auVar10 = vsubps_avx(auVar11,auVar262);
  auVar262 = vfmadd213ps_fma(auVar10,auVar84,auVar262);
  auVar10 = vsubps_avx(auVar12,auVar11);
  auVar10 = vfmadd213ps_fma(auVar10,auVar84,auVar11);
  auVar10 = vsubps_avx(auVar10,auVar262);
  auVar262 = vfmadd231ps_fma(auVar262,auVar10,auVar84);
  auVar85._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
  auVar85._8_4_ = auVar10._8_4_ * 3.0;
  auVar85._12_4_ = auVar10._12_4_ * 3.0;
  auVar256._8_8_ = auVar262._0_8_;
  auVar256._0_8_ = auVar262._0_8_;
  auVar10 = vshufpd_avx(auVar262,auVar262,3);
  auVar262 = vshufps_avx(auVar232,auVar232,0x55);
  auVar230 = vsubps_avx(auVar10,auVar256);
  auVar96 = vfmadd231ps_fma(auVar256,auVar262,auVar230);
  auVar263._8_8_ = auVar85._0_8_;
  auVar263._0_8_ = auVar85._0_8_;
  auVar10 = vshufpd_avx(auVar85,auVar85,3);
  auVar10 = vsubps_avx(auVar10,auVar263);
  auVar65 = vfmadd213ps_fma(auVar10,auVar262,auVar263);
  auVar262 = vmovshdup_avx(auVar65);
  auVar264._0_8_ = auVar262._0_8_ ^ 0x8000000080000000;
  auVar264._8_4_ = auVar262._8_4_ ^ 0x80000000;
  auVar264._12_4_ = auVar262._12_4_ ^ 0x80000000;
  auVar11 = vmovshdup_avx(auVar230);
  auVar10 = vunpcklps_avx(auVar11,auVar264);
  auVar12 = vshufps_avx(auVar10,auVar264,4);
  auVar108 = vshufps_avx(auVar232,auVar232,0x54);
  auVar127._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
  auVar127._8_4_ = auVar230._8_4_ ^ 0x80000000;
  auVar127._12_4_ = auVar230._12_4_ ^ 0x80000000;
  auVar10 = vmovlhps_avx(auVar127,auVar65);
  auVar10 = vshufps_avx(auVar10,auVar65,8);
  auVar262 = vfmsub231ss_fma(ZEXT416((uint)(auVar230._0_4_ * auVar262._0_4_)),auVar11,auVar65);
  uVar62 = auVar262._0_4_;
  auVar86._4_4_ = uVar62;
  auVar86._0_4_ = uVar62;
  auVar86._8_4_ = uVar62;
  auVar86._12_4_ = uVar62;
  auVar262 = vdivps_avx(auVar12,auVar86);
  auVar11 = vdivps_avx(auVar10,auVar86);
  fVar61 = auVar96._0_4_;
  fVar118 = auVar262._0_4_;
  auVar10 = vshufps_avx(auVar96,auVar96,0x55);
  fVar93 = auVar11._0_4_;
  auVar87._0_4_ = fVar61 * fVar118 + auVar10._0_4_ * fVar93;
  auVar87._4_4_ = fVar61 * auVar262._4_4_ + auVar10._4_4_ * auVar11._4_4_;
  auVar87._8_4_ = fVar61 * auVar262._8_4_ + auVar10._8_4_ * auVar11._8_4_;
  auVar87._12_4_ = fVar61 * auVar262._12_4_ + auVar10._12_4_ * auVar11._12_4_;
  auVar64 = vsubps_avx(auVar108,auVar87);
  auVar108 = vmovshdup_avx(auVar262);
  auVar10 = vinsertps_avx(auVar221,auVar244,0x1c);
  auVar153._0_4_ = auVar108._0_4_ * auVar10._0_4_;
  auVar153._4_4_ = auVar108._4_4_ * auVar10._4_4_;
  auVar153._8_4_ = auVar108._8_4_ * auVar10._8_4_;
  auVar153._12_4_ = auVar108._12_4_ * auVar10._12_4_;
  auVar12 = vinsertps_avx(auVar207,auVar236,0x1c);
  auVar99._0_4_ = auVar12._0_4_ * auVar108._0_4_;
  auVar99._4_4_ = auVar12._4_4_ * auVar108._4_4_;
  auVar99._8_4_ = auVar12._8_4_ * auVar108._8_4_;
  auVar99._12_4_ = auVar12._12_4_ * auVar108._12_4_;
  auVar96 = vminps_avx(auVar153,auVar99);
  auVar65 = vmaxps_avx(auVar99,auVar153);
  auVar108 = vinsertps_avx(auVar244,auVar221,0x4c);
  auVar123 = vmovshdup_avx(auVar11);
  auVar230 = vinsertps_avx(auVar236,auVar207,0x4c);
  auVar237._0_4_ = auVar123._0_4_ * auVar108._0_4_;
  auVar237._4_4_ = auVar123._4_4_ * auVar108._4_4_;
  auVar237._8_4_ = auVar123._8_4_ * auVar108._8_4_;
  auVar237._12_4_ = auVar123._12_4_ * auVar108._12_4_;
  auVar222._0_4_ = auVar123._0_4_ * auVar230._0_4_;
  auVar222._4_4_ = auVar123._4_4_ * auVar230._4_4_;
  auVar222._8_4_ = auVar123._8_4_ * auVar230._8_4_;
  auVar222._12_4_ = auVar123._12_4_ * auVar230._12_4_;
  auVar123 = vminps_avx(auVar237,auVar222);
  auVar245._0_4_ = auVar96._0_4_ + auVar123._0_4_;
  auVar245._4_4_ = auVar96._4_4_ + auVar123._4_4_;
  auVar245._8_4_ = auVar96._8_4_ + auVar123._8_4_;
  auVar245._12_4_ = auVar96._12_4_ + auVar123._12_4_;
  auVar96 = vmaxps_avx(auVar222,auVar237);
  auVar100._0_4_ = auVar96._0_4_ + auVar65._0_4_;
  auVar100._4_4_ = auVar96._4_4_ + auVar65._4_4_;
  auVar100._8_4_ = auVar96._8_4_ + auVar65._8_4_;
  auVar100._12_4_ = auVar96._12_4_ + auVar65._12_4_;
  auVar223._8_8_ = 0x3f80000000000000;
  auVar223._0_8_ = 0x3f80000000000000;
  auVar65 = vsubps_avx(auVar223,auVar100);
  auVar96 = vsubps_avx(auVar223,auVar245);
  auVar123 = vsubps_avx(auVar235,auVar232);
  auVar132 = vsubps_avx(auVar66,auVar232);
  auVar112._0_4_ = fVar118 * auVar10._0_4_;
  auVar112._4_4_ = fVar118 * auVar10._4_4_;
  auVar112._8_4_ = fVar118 * auVar10._8_4_;
  auVar112._12_4_ = fVar118 * auVar10._12_4_;
  auVar246._0_4_ = fVar118 * auVar12._0_4_;
  auVar246._4_4_ = fVar118 * auVar12._4_4_;
  auVar246._8_4_ = fVar118 * auVar12._8_4_;
  auVar246._12_4_ = fVar118 * auVar12._12_4_;
  auVar12 = vminps_avx(auVar112,auVar246);
  auVar10 = vmaxps_avx(auVar246,auVar112);
  auVar154._0_4_ = fVar93 * auVar108._0_4_;
  auVar154._4_4_ = fVar93 * auVar108._4_4_;
  auVar154._8_4_ = fVar93 * auVar108._8_4_;
  auVar154._12_4_ = fVar93 * auVar108._12_4_;
  auVar208._0_4_ = fVar93 * auVar230._0_4_;
  auVar208._4_4_ = fVar93 * auVar230._4_4_;
  auVar208._8_4_ = fVar93 * auVar230._8_4_;
  auVar208._12_4_ = fVar93 * auVar230._12_4_;
  auVar108 = vminps_avx(auVar154,auVar208);
  auVar247._0_4_ = auVar12._0_4_ + auVar108._0_4_;
  auVar247._4_4_ = auVar12._4_4_ + auVar108._4_4_;
  auVar247._8_4_ = auVar12._8_4_ + auVar108._8_4_;
  auVar247._12_4_ = auVar12._12_4_ + auVar108._12_4_;
  fVar176 = auVar123._0_4_;
  auVar257._0_4_ = fVar176 * auVar65._0_4_;
  fVar190 = auVar123._4_4_;
  auVar257._4_4_ = fVar190 * auVar65._4_4_;
  fVar191 = auVar123._8_4_;
  auVar257._8_4_ = fVar191 * auVar65._8_4_;
  fVar192 = auVar123._12_4_;
  auVar257._12_4_ = fVar192 * auVar65._12_4_;
  auVar12 = vmaxps_avx(auVar208,auVar154);
  auVar209._0_4_ = fVar176 * auVar96._0_4_;
  auVar209._4_4_ = fVar190 * auVar96._4_4_;
  auVar209._8_4_ = fVar191 * auVar96._8_4_;
  auVar209._12_4_ = fVar192 * auVar96._12_4_;
  fVar61 = auVar132._0_4_;
  auVar101._0_4_ = fVar61 * auVar65._0_4_;
  fVar63 = auVar132._4_4_;
  auVar101._4_4_ = fVar63 * auVar65._4_4_;
  fVar143 = auVar132._8_4_;
  auVar101._8_4_ = fVar143 * auVar65._8_4_;
  fVar214 = auVar132._12_4_;
  auVar101._12_4_ = fVar214 * auVar65._12_4_;
  auVar224._0_4_ = fVar61 * auVar96._0_4_;
  auVar224._4_4_ = fVar63 * auVar96._4_4_;
  auVar224._8_4_ = fVar143 * auVar96._8_4_;
  auVar224._12_4_ = fVar214 * auVar96._12_4_;
  auVar113._0_4_ = auVar10._0_4_ + auVar12._0_4_;
  auVar113._4_4_ = auVar10._4_4_ + auVar12._4_4_;
  auVar113._8_4_ = auVar10._8_4_ + auVar12._8_4_;
  auVar113._12_4_ = auVar10._12_4_ + auVar12._12_4_;
  auVar155._8_8_ = 0x3f800000;
  auVar155._0_8_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar155,auVar113);
  auVar12 = vsubps_avx(auVar155,auVar247);
  auVar248._0_4_ = fVar176 * auVar10._0_4_;
  auVar248._4_4_ = fVar190 * auVar10._4_4_;
  auVar248._8_4_ = fVar191 * auVar10._8_4_;
  auVar248._12_4_ = fVar192 * auVar10._12_4_;
  auVar238._0_4_ = fVar176 * auVar12._0_4_;
  auVar238._4_4_ = fVar190 * auVar12._4_4_;
  auVar238._8_4_ = fVar191 * auVar12._8_4_;
  auVar238._12_4_ = fVar192 * auVar12._12_4_;
  auVar114._0_4_ = fVar61 * auVar10._0_4_;
  auVar114._4_4_ = fVar63 * auVar10._4_4_;
  auVar114._8_4_ = fVar143 * auVar10._8_4_;
  auVar114._12_4_ = fVar214 * auVar10._12_4_;
  auVar156._0_4_ = fVar61 * auVar12._0_4_;
  auVar156._4_4_ = fVar63 * auVar12._4_4_;
  auVar156._8_4_ = fVar143 * auVar12._8_4_;
  auVar156._12_4_ = fVar214 * auVar12._12_4_;
  auVar10 = vminps_avx(auVar248,auVar238);
  auVar12 = vminps_avx(auVar114,auVar156);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar12 = vmaxps_avx(auVar238,auVar248);
  auVar108 = vmaxps_avx(auVar156,auVar114);
  auVar230 = vminps_avx(auVar257,auVar209);
  auVar65 = vminps_avx(auVar101,auVar224);
  auVar230 = vminps_avx(auVar230,auVar65);
  auVar10 = vhaddps_avx(auVar10,auVar230);
  auVar12 = vmaxps_avx(auVar108,auVar12);
  auVar108 = vmaxps_avx(auVar209,auVar257);
  auVar230 = vmaxps_avx(auVar224,auVar101);
  auVar108 = vmaxps_avx(auVar230,auVar108);
  auVar12 = vhaddps_avx(auVar12,auVar108);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar225._0_4_ = auVar64._0_4_ + auVar10._0_4_;
  auVar225._4_4_ = auVar64._4_4_ + auVar10._4_4_;
  auVar225._8_4_ = auVar64._8_4_ + auVar10._8_4_;
  auVar225._12_4_ = auVar64._12_4_ + auVar10._12_4_;
  auVar210._0_4_ = auVar64._0_4_ + auVar12._0_4_;
  auVar210._4_4_ = auVar64._4_4_ + auVar12._4_4_;
  auVar210._8_4_ = auVar64._8_4_ + auVar12._8_4_;
  auVar210._12_4_ = auVar64._12_4_ + auVar12._12_4_;
  auVar213 = ZEXT1664(auVar210);
  auVar10 = vmaxps_avx(auVar235,auVar225);
  auVar12 = vminps_avx(auVar210,auVar66);
  auVar10 = vcmpps_avx(auVar12,auVar10,1);
  auVar10 = vshufps_avx(auVar10,auVar10,0x50);
  if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar10[0xf] < '\0')
  goto LAB_015cff57;
  bVar54 = 0;
  if ((auVar189._0_4_ < auVar225._0_4_) && (bVar54 = 0, auVar210._0_4_ < auVar66._0_4_)) {
    auVar12 = vmovshdup_avx(auVar225);
    auVar10 = vcmpps_avx(auVar210,auVar66,1);
    bVar54 = auVar10[4] & auVar95._0_4_ < auVar12._0_4_;
  }
  if (((3 < uVar51 || fVar60 < 0.001) | bVar54) == 1) {
    lVar53 = 200;
    auVar213 = ZEXT1664(local_488);
    do {
      fVar63 = auVar64._0_4_;
      fVar61 = 1.0 - fVar63;
      fVar60 = fVar61 * fVar61 * fVar61;
      fVar92 = fVar63 * 3.0 * fVar61 * fVar61;
      fVar61 = fVar61 * fVar63 * fVar63 * 3.0;
      auVar138._4_4_ = fVar60;
      auVar138._0_4_ = fVar60;
      auVar138._8_4_ = fVar60;
      auVar138._12_4_ = fVar60;
      auVar115._4_4_ = fVar92;
      auVar115._0_4_ = fVar92;
      auVar115._8_4_ = fVar92;
      auVar115._12_4_ = fVar92;
      auVar102._4_4_ = fVar61;
      auVar102._0_4_ = fVar61;
      auVar102._8_4_ = fVar61;
      auVar102._12_4_ = fVar61;
      fVar63 = fVar63 * fVar63 * fVar63;
      auVar157._0_4_ = (float)local_238._0_4_ * fVar63;
      auVar157._4_4_ = (float)local_238._4_4_ * fVar63;
      auVar157._8_4_ = fStack_230 * fVar63;
      auVar157._12_4_ = fStack_22c * fVar63;
      auVar13 = vfmadd231ps_fma(auVar157,local_4f8,auVar102);
      auVar13 = vfmadd231ps_fma(auVar13,local_4e8,auVar115);
      auVar13 = vfmadd231ps_fma(auVar13,local_488,auVar138);
      auVar103._8_8_ = auVar13._0_8_;
      auVar103._0_8_ = auVar13._0_8_;
      auVar13 = vshufpd_avx(auVar13,auVar13,3);
      auVar10 = vshufps_avx(auVar64,auVar64,0x55);
      auVar13 = vsubps_avx(auVar13,auVar103);
      auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar103);
      fVar60 = auVar10._0_4_;
      auVar13 = vshufps_avx(auVar10,auVar10,0x55);
      auVar104._0_4_ = fVar118 * fVar60 + fVar93 * auVar13._0_4_;
      auVar104._4_4_ = auVar262._4_4_ * fVar60 + auVar11._4_4_ * auVar13._4_4_;
      auVar104._8_4_ = auVar262._8_4_ * fVar60 + auVar11._8_4_ * auVar13._8_4_;
      auVar104._12_4_ = auVar262._12_4_ * fVar60 + auVar11._12_4_ * auVar13._12_4_;
      auVar64 = vsubps_avx(auVar64,auVar104);
      auVar13 = vandps_avx(local_3f8,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
      auVar13 = vmaxss_avx(auVar10,auVar13);
      if (auVar13._0_4_ < (float)local_4d8._0_4_) {
        fVar60 = auVar64._0_4_;
        if ((0.0 <= fVar60) && (fVar60 <= 1.0)) {
          auVar13 = vmovshdup_avx(auVar64);
          fVar92 = auVar13._0_4_;
          if ((0.0 <= fVar92) && (fVar92 <= 1.0)) {
            auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
            auVar108 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28
                                    );
            aVar2 = (ray->org).field_0;
            auVar13 = vsubps_avx(local_418,(undefined1  [16])aVar2);
            auVar13 = vdpps_avx(auVar13,auVar108,0x7f);
            auVar10 = vsubps_avx(local_448,(undefined1  [16])aVar2);
            auVar10 = vdpps_avx(auVar10,auVar108,0x7f);
            auVar262 = vsubps_avx(local_458,(undefined1  [16])aVar2);
            auVar262 = vdpps_avx(auVar262,auVar108,0x7f);
            auVar11 = vsubps_avx(local_438,(undefined1  [16])aVar2);
            auVar11 = vdpps_avx(auVar11,auVar108,0x7f);
            auVar12 = vsubps_avx(_local_428,(undefined1  [16])aVar2);
            auVar12 = vdpps_avx(auVar12,auVar108,0x7f);
            auVar235 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
            auVar235 = vdpps_avx(auVar235,auVar108,0x7f);
            auVar66 = vsubps_avx(_local_478,(undefined1  [16])aVar2);
            auVar66 = vdpps_avx(auVar66,auVar108,0x7f);
            auVar46._4_4_ = fStack_4b4;
            auVar46._0_4_ = local_4b8;
            auVar46._8_4_ = fStack_4b0;
            auVar46._12_4_ = fStack_4ac;
            auVar230 = vsubps_avx(auVar46,(undefined1  [16])aVar2);
            auVar108 = vdpps_avx(auVar230,auVar108,0x7f);
            fVar118 = 1.0 - fVar92;
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar92)),ZEXT416((uint)fVar118)
                                      ,auVar13);
            auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar235._0_4_ * fVar92)),
                                      ZEXT416((uint)fVar118),auVar10);
            auVar262 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar92)),
                                       ZEXT416((uint)fVar118),auVar262);
            auVar213 = ZEXT1664(auVar262);
            auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar108._0_4_)),
                                      ZEXT416((uint)fVar118),auVar11);
            fVar61 = 1.0 - fVar60;
            fVar92 = fVar61 * fVar60 * fVar60 * 3.0;
            fVar143 = fVar60 * fVar60 * fVar60;
            auVar262 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar143)),
                                       ZEXT416((uint)fVar92),auVar262);
            fVar118 = fVar60 * 3.0 * fVar61 * fVar61;
            auVar10 = vfmadd231ss_fma(auVar262,ZEXT416((uint)fVar118),auVar10);
            fVar93 = fVar61 * fVar61 * fVar61;
            auVar13 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar93),auVar13);
            fVar63 = auVar13._0_4_;
            if (((ray->org).field_0.m128[3] <= fVar63) && (fVar214 = ray->tfar, fVar63 <= fVar214))
            {
              pGVar5 = (context->scene->geometries).items[local_4c0].ptr;
              if ((pGVar5->mask & ray->mask) == 0) {
                bVar54 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar54 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar13 = vshufps_avx(auVar64,auVar64,0x55);
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar10 = vsubps_avx(auVar199,auVar13);
                fVar176 = auVar13._0_4_;
                auVar211._0_4_ = fVar176 * (float)local_428._0_4_;
                fVar190 = auVar13._4_4_;
                auVar211._4_4_ = fVar190 * (float)local_428._4_4_;
                fVar191 = auVar13._8_4_;
                auVar211._8_4_ = fVar191 * fStack_420;
                fVar192 = auVar13._12_4_;
                auVar211._12_4_ = fVar192 * fStack_41c;
                auVar226._0_4_ = fVar176 * (float)local_468._0_4_;
                auVar226._4_4_ = fVar190 * (float)local_468._4_4_;
                auVar226._8_4_ = fVar191 * fStack_460;
                auVar226._12_4_ = fVar192 * fStack_45c;
                auVar233._0_4_ = fVar176 * (float)local_478._0_4_;
                auVar233._4_4_ = fVar190 * (float)local_478._4_4_;
                auVar233._8_4_ = fVar191 * fStack_470;
                auVar233._12_4_ = fVar192 * fStack_46c;
                auVar184._0_4_ = fVar176 * local_4b8;
                auVar184._4_4_ = fVar190 * fStack_4b4;
                auVar184._8_4_ = fVar191 * fStack_4b0;
                auVar184._12_4_ = fVar192 * fStack_4ac;
                auVar13 = vfmadd231ps_fma(auVar211,auVar10,local_418);
                auVar262 = vfmadd231ps_fma(auVar226,auVar10,local_448);
                auVar11 = vfmadd231ps_fma(auVar233,auVar10,local_458);
                auVar12 = vfmadd231ps_fma(auVar184,auVar10,local_438);
                auVar13 = vsubps_avx(auVar262,auVar13);
                auVar10 = vsubps_avx(auVar11,auVar262);
                auVar213 = ZEXT1664(auVar10);
                auVar262 = vsubps_avx(auVar12,auVar11);
                auVar234._0_4_ = fVar60 * auVar10._0_4_;
                auVar234._4_4_ = fVar60 * auVar10._4_4_;
                auVar234._8_4_ = fVar60 * auVar10._8_4_;
                auVar234._12_4_ = fVar60 * auVar10._12_4_;
                auVar174._4_4_ = fVar61;
                auVar174._0_4_ = fVar61;
                auVar174._8_4_ = fVar61;
                auVar174._12_4_ = fVar61;
                auVar13 = vfmadd231ps_fma(auVar234,auVar174,auVar13);
                auVar185._0_4_ = fVar60 * auVar262._0_4_;
                auVar185._4_4_ = fVar60 * auVar262._4_4_;
                auVar185._8_4_ = fVar60 * auVar262._8_4_;
                auVar185._12_4_ = fVar60 * auVar262._12_4_;
                auVar262 = vfmadd231ps_fma(auVar185,auVar174,auVar10);
                auVar186._0_4_ = fVar60 * auVar262._0_4_;
                auVar186._4_4_ = fVar60 * auVar262._4_4_;
                auVar186._8_4_ = fVar60 * auVar262._8_4_;
                auVar186._12_4_ = fVar60 * auVar262._12_4_;
                auVar262 = vfmadd231ps_fma(auVar186,auVar174,auVar13);
                auVar158._0_4_ = fVar143 * (float)local_298._0_4_;
                auVar158._4_4_ = fVar143 * (float)local_298._4_4_;
                auVar158._8_4_ = fVar143 * fStack_290;
                auVar158._12_4_ = fVar143 * fStack_28c;
                auVar116._4_4_ = fVar92;
                auVar116._0_4_ = fVar92;
                auVar116._8_4_ = fVar92;
                auVar116._12_4_ = fVar92;
                auVar13 = vfmadd132ps_fma(auVar116,auVar158,local_288);
                auVar139._4_4_ = fVar118;
                auVar139._0_4_ = fVar118;
                auVar139._8_4_ = fVar118;
                auVar139._12_4_ = fVar118;
                auVar13 = vfmadd132ps_fma(auVar139,auVar13,local_278);
                auVar117._0_4_ = auVar262._0_4_ * 3.0;
                auVar117._4_4_ = auVar262._4_4_ * 3.0;
                auVar117._8_4_ = auVar262._8_4_ * 3.0;
                auVar117._12_4_ = auVar262._12_4_ * 3.0;
                auVar128._4_4_ = fVar93;
                auVar128._0_4_ = fVar93;
                auVar128._8_4_ = fVar93;
                auVar128._12_4_ = fVar93;
                auVar262 = vfmadd132ps_fma(auVar128,auVar13,local_268);
                auVar13 = vshufps_avx(auVar117,auVar117,0xc9);
                auVar140._0_4_ = auVar262._0_4_ * auVar13._0_4_;
                auVar140._4_4_ = auVar262._4_4_ * auVar13._4_4_;
                auVar140._8_4_ = auVar262._8_4_ * auVar13._8_4_;
                auVar140._12_4_ = auVar262._12_4_ * auVar13._12_4_;
                auVar13 = vshufps_avx(auVar262,auVar262,0xc9);
                auVar262 = vfmsub231ps_fma(auVar140,auVar117,auVar13);
                auVar13 = vshufps_avx(auVar262,auVar262,0xe9);
                local_2c8 = vmovlps_avx(auVar13);
                local_2c0 = auVar262._0_4_;
                local_2bc = vmovlps_avx(auVar64);
                local_2b4 = (int)local_370;
                local_2b0 = (int)local_4c0;
                local_2ac = context->user->instID[0];
                local_2a8 = context->user->instPrimID[0];
                ray->tfar = fVar63;
                local_4fc = -1;
                local_348.valid = &local_4fc;
                local_348.geometryUserPtr = pGVar5->userPtr;
                local_348.context = context->user;
                local_348.hit = (RTCHitN *)&local_2c8;
                local_348.N = 1;
                local_348.ray = (RTCRayN *)ray;
                if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015d0c5e:
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar213 = ZEXT1664(auVar213._0_16_);
                    (*p_Var6)(&local_348);
                    if (*local_348.valid == 0) goto LAB_015d0cb0;
                  }
                  bVar54 = 1;
                }
                else {
                  auVar213 = ZEXT1664(auVar10);
                  (*pGVar5->occlusionFilterN)(&local_348);
                  if (*local_348.valid != 0) goto LAB_015d0c5e;
LAB_015d0cb0:
                  ray->tfar = fVar214;
                  bVar54 = 0;
                }
              }
              bVar57 = (bool)(bVar57 | bVar54);
            }
          }
        }
        break;
      }
      lVar53 = lVar53 + -1;
    } while (lVar53 != 0);
    goto LAB_015cff57;
  }
  local_248 = vinsertps_avx(auVar13,ZEXT416((uint)fVar92),0x10);
  auVar77 = vinsertps_avx(auVar95,ZEXT416((uint)auVar131._0_4_),0x10);
  goto LAB_015cf9dd;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }